

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  uint *puVar3;
  fpclass_type fVar4;
  undefined4 uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  type_conflict5 tVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  undefined8 *puVar20;
  VarStatus VVar21;
  pointer pnVar22;
  long lVar23;
  VarStatus *pVVar24;
  undefined8 uVar25;
  cpp_dec_float<100U,_int,_void> *pcVar26;
  cpp_dec_float<100U,_int,_void> *pcVar27;
  long in_FS_OFFSET;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_24;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  cpp_dec_float<100U,_int,_void> local_1958;
  double local_1908;
  undefined8 uStack_1900;
  cpp_dec_float<100U,_int,_void> local_18f8;
  undefined4 local_18a8;
  uint uStack_18a4;
  undefined4 uStack_18a0;
  undefined4 uStack_189c;
  cpp_dec_float<100U,_int,_void> local_1898;
  cpp_dec_float<100U,_int,_void> local_1848;
  cpp_dec_float<100U,_int,_void> local_17f8;
  cpp_dec_float<100U,_int,_void> local_17a8;
  cpp_dec_float<100U,_int,_void> local_1758;
  cpp_dec_float<100U,_int,_void> local_1708;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_16b8;
  cpp_dec_float<100U,_int,_void> local_1668;
  cpp_dec_float<100U,_int,_void> local_1618;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_15c8;
  cpp_dec_float<100U,_int,_void> local_1578;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1528;
  cpp_dec_float<100U,_int,_void> local_14d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1488;
  cpp_dec_float<100U,_int,_void> local_1438;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13e8;
  cpp_dec_float<100U,_int,_void> local_1398;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1348;
  cpp_dec_float<100U,_int,_void> local_12f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12a8;
  cpp_dec_float<100U,_int,_void> local_1258;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1208;
  cpp_dec_float<100U,_int,_void> local_11b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1168;
  cpp_dec_float<100U,_int,_void> local_1118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10c8;
  cpp_dec_float<100U,_int,_void> local_1078;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1028;
  cpp_dec_float<100U,_int,_void> local_fd8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ee8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e98;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  int local_e08;
  undefined1 local_e04;
  undefined8 local_e00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_df8;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  int local_d68;
  undefined1 local_d64;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined5 uStack_d20;
  undefined3 uStack_d1b;
  undefined5 uStack_d18;
  undefined8 local_d10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d08;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined5 uStack_c80;
  undefined3 uStack_c7b;
  undefined5 uStack_c78;
  undefined8 local_c70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined5 uStack_aa0;
  undefined3 uStack_a9b;
  undefined5 uStack_a98;
  undefined8 local_a90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a88;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined5 uStack_a00;
  undefined3 uStack_9fb;
  undefined5 uStack_9f8;
  undefined8 local_9f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_998;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_948;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_850;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_800;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_760;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_710;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_670;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_620;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_580;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_440;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_300;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    lVar18 = (long)(this->m_perm).thesize;
    if (lVar18 < 1) {
      return;
    }
    uVar19 = lVar18 + 1;
    lVar18 = lVar18 * 0x14 + -2;
    do {
      lVar23 = (long)(this->m_perm).data[uVar19 - 2];
      if (-1 < lVar23) {
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = *(undefined8 *)&pnVar22[lVar23].m_backend.data;
        uVar8 = *(undefined8 *)(pnVar22[lVar23].m_backend.data._M_elems + 2);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 4;
        uVar9 = *(undefined8 *)puVar3;
        uVar10 = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 8;
        uVar11 = *(undefined8 *)puVar3;
        uVar12 = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 0xc;
        uVar13 = *(undefined8 *)(puVar3 + 2);
        puVar2 = (pnVar22->m_backend).data._M_elems + lVar18 + -6;
        *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
        *(undefined8 *)(puVar2 + 2) = uVar13;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18 + -10;
        *(undefined8 *)puVar3 = uVar11;
        *(undefined8 *)(puVar3 + 2) = uVar12;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18 + -0xe;
        *(undefined8 *)puVar3 = uVar9;
        *(undefined8 *)(puVar3 + 2) = uVar10;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18 + -0x12;
        *(undefined8 *)puVar3 = uVar25;
        *(undefined8 *)(puVar3 + 2) = uVar8;
        (pnVar22->m_backend).data._M_elems[lVar18 + -2] = pnVar22[lVar23].m_backend.exp;
        *(bool *)((pnVar22->m_backend).data._M_elems + lVar18 + -1) = pnVar22[lVar23].m_backend.neg;
        iVar14 = pnVar22[lVar23].m_backend.prec_elem;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18;
        puVar3[0] = pnVar22[lVar23].m_backend.fpclass;
        puVar3[1] = iVar14;
        pnVar22 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = *(undefined8 *)&pnVar22[lVar23].m_backend.data;
        uVar8 = *(undefined8 *)(pnVar22[lVar23].m_backend.data._M_elems + 2);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 4;
        uVar9 = *(undefined8 *)puVar3;
        uVar10 = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 8;
        uVar11 = *(undefined8 *)puVar3;
        uVar12 = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 0xc;
        uVar13 = *(undefined8 *)(puVar3 + 2);
        puVar2 = (pnVar22->m_backend).data._M_elems + lVar18 + -6;
        *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
        *(undefined8 *)(puVar2 + 2) = uVar13;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18 + -10;
        *(undefined8 *)puVar3 = uVar11;
        *(undefined8 *)(puVar3 + 2) = uVar12;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18 + -0xe;
        *(undefined8 *)puVar3 = uVar9;
        *(undefined8 *)(puVar3 + 2) = uVar10;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18 + -0x12;
        *(undefined8 *)puVar3 = uVar25;
        *(undefined8 *)(puVar3 + 2) = uVar8;
        (pnVar22->m_backend).data._M_elems[lVar18 + -2] = pnVar22[lVar23].m_backend.exp;
        *(bool *)((pnVar22->m_backend).data._M_elems + lVar18 + -1) = pnVar22[lVar23].m_backend.neg;
        iVar14 = pnVar22[lVar23].m_backend.prec_elem;
        puVar3 = (pnVar22->m_backend).data._M_elems + lVar18;
        puVar3[0] = pnVar22[lVar23].m_backend.fpclass;
        puVar3[1] = iVar14;
        cStatus->data[uVar19 - 2] = cStatus->data[lVar23];
      }
      uVar19 = uVar19 - 1;
      lVar18 = lVar18 + -0x14;
    } while (1 < uVar19);
    return;
  }
  iVar17 = this->m_k;
  switch(cStatus->data[iVar17]) {
  case ON_UPPER:
    pnVar22 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
    uVar8 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
    uVar10 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
    uVar11 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
    uVar12 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 10);
    uVar13 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xe);
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xc);
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar11;
    *(undefined8 *)(puVar3 + 2) = uVar12;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar9;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
    *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
    pnVar22[iVar17].m_backend.exp = (this->m_upK).m_backend.exp;
    pnVar22[iVar17].m_backend.neg = (this->m_upK).m_backend.neg;
    iVar14 = (this->m_upK).m_backend.prec_elem;
    pnVar22[iVar17].m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    pnVar22[iVar17].m_backend.prec_elem = iVar14;
    if ((this->m_scale).m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_1898,0,(type *)0x0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(this->m_scale).m_backend,&local_1898);
      if (0 < iVar17) {
        iVar17 = this->m_j;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
        uVar8 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
        uVar9 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
        uVar10 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
        uVar11 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
        uVar12 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 10);
        uVar13 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xe);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar3 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xc);
        *(undefined8 *)(puVar3 + 2) = uVar13;
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar3 = uVar11;
        *(undefined8 *)(puVar3 + 2) = uVar12;
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = uVar9;
        *(undefined8 *)(puVar3 + 2) = uVar10;
        *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
        *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
        pnVar22[iVar17].m_backend.exp = (this->m_upJ).m_backend.exp;
        pnVar22[iVar17].m_backend.neg = (this->m_upJ).m_backend.neg;
        iVar14 = (this->m_upJ).m_backend.prec_elem;
        pnVar22[iVar17].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
        pnVar22[iVar17].m_backend.prec_elem = iVar14;
        if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) {
          VVar21 = ON_UPPER;
        }
        else {
          VVar21 = ON_UPPER;
          if ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) {
            iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
            VVar21 = (uint)(iVar17 == 0) * 2;
          }
        }
        cStatus->data[this->m_j] = VVar21;
        break;
      }
    }
LAB_004401b2:
    iVar17 = this->m_j;
    pnVar22 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = *(undefined8 *)(this->m_loJ).m_backend.data._M_elems;
    uVar8 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
    uVar10 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
    uVar11 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    uVar12 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 10);
    uVar13 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xe);
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xc);
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar11;
    *(undefined8 *)(puVar3 + 2) = uVar12;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar9;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
    *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
    pnVar22[iVar17].m_backend.exp = (this->m_loJ).m_backend.exp;
    pnVar22[iVar17].m_backend.neg = (this->m_loJ).m_backend.neg;
    uVar5 = (this->m_loJ).m_backend.fpclass;
    uVar7 = (this->m_loJ).m_backend.prec_elem;
    pnVar22[iVar17].m_backend.fpclass = uVar5;
    pnVar22[iVar17].m_backend.prec_elem = uVar7;
    VVar21 = ON_LOWER;
    if ((uVar5 != 2) && ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
      VVar21 = (iVar17 == 0) + ON_LOWER;
    }
    goto LAB_004402ca;
  case ON_LOWER:
    pnVar22 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = *(undefined8 *)(this->m_loK).m_backend.data._M_elems;
    uVar8 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
    uVar10 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
    uVar11 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    uVar12 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 10);
    uVar13 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xe);
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xc);
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar11;
    *(undefined8 *)(puVar3 + 2) = uVar12;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar9;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
    *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
    pnVar22[iVar17].m_backend.exp = (this->m_loK).m_backend.exp;
    pnVar22[iVar17].m_backend.neg = (this->m_loK).m_backend.neg;
    iVar14 = (this->m_loK).m_backend.prec_elem;
    pnVar22[iVar17].m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    pnVar22[iVar17].m_backend.prec_elem = iVar14;
    if ((this->m_scale).m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_1898,0,(type *)0x0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(this->m_scale).m_backend,&local_1898);
      if (0 < iVar17) goto LAB_004401b2;
    }
    iVar17 = this->m_j;
    pnVar22 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
    uVar8 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
    uVar10 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
    uVar11 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
    uVar12 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 10);
    uVar13 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xe);
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xc);
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar11;
    *(undefined8 *)(puVar3 + 2) = uVar12;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar9;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
    *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
    pnVar22[iVar17].m_backend.exp = (this->m_upJ).m_backend.exp;
    pnVar22[iVar17].m_backend.neg = (this->m_upJ).m_backend.neg;
    iVar14 = (this->m_upJ).m_backend.prec_elem;
    pnVar22[iVar17].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
    pnVar22[iVar17].m_backend.prec_elem = iVar14;
    VVar21 = ON_UPPER;
    if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
      VVar21 = (uint)(iVar17 == 0) * 2;
    }
LAB_004402ca:
    cStatus->data[this->m_j] = VVar21;
    break;
  case FIXED:
    iVar17 = this->m_j;
    pnVar22 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = *(undefined8 *)(this->m_loJ).m_backend.data._M_elems;
    uVar8 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
    uVar10 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
    uVar11 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    uVar12 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 10);
    uVar13 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xe);
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xc);
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar3 = uVar11;
    *(undefined8 *)(puVar3 + 2) = uVar12;
    puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar9;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
    *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
    pnVar22[iVar17].m_backend.exp = (this->m_loJ).m_backend.exp;
    pnVar22[iVar17].m_backend.neg = (this->m_loJ).m_backend.neg;
    iVar14 = (this->m_loJ).m_backend.prec_elem;
    pnVar22[iVar17].m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    pnVar22[iVar17].m_backend.prec_elem = iVar14;
    cStatus->data[this->m_j] = FIXED;
    break;
  case ZERO:
    pnVar6 = &this->m_loK;
    local_8a8.m_backend.data._M_elems[0] = (this->m_loK).m_backend.data._M_elems[0];
    local_8a8.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
    local_8a8.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
    local_8a8.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
    local_8a8.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
    local_8a8.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
    local_8a8.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
    local_8a8.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
    local_8a8.m_backend.data._M_elems[8] = (this->m_loK).m_backend.data._M_elems[8];
    local_8a8.m_backend.data._M_elems[9] = (this->m_loK).m_backend.data._M_elems[9];
    local_8a8.m_backend.data._M_elems[10] = (this->m_loK).m_backend.data._M_elems[10];
    local_8a8.m_backend.data._M_elems[0xb] = (this->m_loK).m_backend.data._M_elems[0xb];
    local_8a8.m_backend.data._M_elems[0xc] = (this->m_loK).m_backend.data._M_elems[0xc];
    local_8a8.m_backend.data._M_elems[0xd] = (this->m_loK).m_backend.data._M_elems[0xd];
    local_8a8.m_backend.data._M_elems[0xe] = (this->m_loK).m_backend.data._M_elems[0xe];
    local_8a8.m_backend.data._M_elems[0xf] = (this->m_loK).m_backend.data._M_elems[0xf];
    local_8a8.m_backend.exp = (this->m_loK).m_backend.exp;
    local_8a8.m_backend.neg = (this->m_loK).m_backend.neg;
    local_8a8.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_8a8.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_80,this);
    bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_8a8,&local_80);
    if (bVar16) {
      local_8f8.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
      local_8f8.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
      local_8f8.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
      local_8f8.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
      local_8f8.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
      local_8f8.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
      local_8f8.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
      local_8f8.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
      local_8f8.m_backend.data._M_elems[8] = (this->m_upK).m_backend.data._M_elems[8];
      local_8f8.m_backend.data._M_elems[9] = (this->m_upK).m_backend.data._M_elems[9];
      local_8f8.m_backend.data._M_elems[10] = (this->m_upK).m_backend.data._M_elems[10];
      local_8f8.m_backend.data._M_elems[0xb] = (this->m_upK).m_backend.data._M_elems[0xb];
      local_8f8.m_backend.data._M_elems[0xc] = (this->m_upK).m_backend.data._M_elems[0xc];
      local_8f8.m_backend.data._M_elems[0xd] = (this->m_upK).m_backend.data._M_elems[0xd];
      local_8f8.m_backend.data._M_elems[0xe] = (this->m_upK).m_backend.data._M_elems[0xe];
      local_8f8.m_backend.data._M_elems[0xf] = (this->m_upK).m_backend.data._M_elems[0xf];
      local_8f8.m_backend.exp = (this->m_upK).m_backend.exp;
      local_8f8.m_backend.neg = (this->m_upK).m_backend.neg;
      local_8f8.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
      local_8f8.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_d0,this);
      bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_8f8,&local_d0);
      if (((!bVar16) || ((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN)) ||
         (((this->m_upK).m_backend.fpclass == cpp_dec_float_NaN ||
          (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&pnVar6->m_backend,&(this->m_upK).m_backend), iVar17 != 0))))
      goto LAB_0043fcec;
      VVar21 = FIXED;
    }
    else {
LAB_0043fcec:
      local_948.m_backend.data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      local_948.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
      local_948.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
      local_948.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
      local_948.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
      local_948.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
      local_948.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
      local_948.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
      local_948.m_backend.data._M_elems[8] = (this->m_loK).m_backend.data._M_elems[8];
      local_948.m_backend.data._M_elems[9] = (this->m_loK).m_backend.data._M_elems[9];
      local_948.m_backend.data._M_elems[10] = (this->m_loK).m_backend.data._M_elems[10];
      local_948.m_backend.data._M_elems[0xb] = (this->m_loK).m_backend.data._M_elems[0xb];
      local_948.m_backend.data._M_elems[0xc] = (this->m_loK).m_backend.data._M_elems[0xc];
      local_948.m_backend.data._M_elems[0xd] = (this->m_loK).m_backend.data._M_elems[0xd];
      local_948.m_backend.data._M_elems[0xe] = (this->m_loK).m_backend.data._M_elems[0xe];
      local_948.m_backend.data._M_elems[0xf] = (this->m_loK).m_backend.data._M_elems[0xf];
      local_948.m_backend.exp = (this->m_loK).m_backend.exp;
      local_948.m_backend.neg = (this->m_loK).m_backend.neg;
      local_948.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
      local_948.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_120,this);
      bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_948,&local_120);
      VVar21 = ON_LOWER;
      if (!bVar16) {
        local_998.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
        local_998.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
        local_998.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
        local_998.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
        local_998.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
        local_998.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
        local_998.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
        local_998.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
        local_998.m_backend.data._M_elems[8] = (this->m_upK).m_backend.data._M_elems[8];
        local_998.m_backend.data._M_elems[9] = (this->m_upK).m_backend.data._M_elems[9];
        local_998.m_backend.data._M_elems[10] = (this->m_upK).m_backend.data._M_elems[10];
        local_998.m_backend.data._M_elems[0xb] = (this->m_upK).m_backend.data._M_elems[0xb];
        local_998.m_backend.data._M_elems[0xc] = (this->m_upK).m_backend.data._M_elems[0xc];
        local_998.m_backend.data._M_elems[0xd] = (this->m_upK).m_backend.data._M_elems[0xd];
        local_998.m_backend.data._M_elems[0xe] = (this->m_upK).m_backend.data._M_elems[0xe];
        local_998.m_backend.data._M_elems[0xf] = (this->m_upK).m_backend.data._M_elems[0xf];
        local_998.m_backend.exp = (this->m_upK).m_backend.exp;
        local_998.m_backend.neg = (this->m_upK).m_backend.neg;
        local_998.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
        local_998.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_170,this);
        bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_998,&local_170);
        VVar21 = ON_UPPER;
        if (!bVar16) {
          local_9e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar6->m_backend).data._M_elems
          ;
          local_9e8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
          local_9e8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
          local_9e8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
          local_9e8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
          local_9e8.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 10);
          local_9e8.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xc);
          local_9e8.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xe);
          local_9e8.m_backend.exp = (this->m_loK).m_backend.exp;
          local_9e8.m_backend.neg = (this->m_loK).m_backend.neg;
          local_9e8.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          local_9e8.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
          local_9f0 = 0x1000000000;
          local_a38 = 0;
          uStack_a30 = 0;
          local_a28 = 0;
          uStack_a20 = 0;
          local_a18 = 0;
          uStack_a10 = 0;
          local_a08 = 0;
          uStack_a00 = 0;
          uStack_9fb = 0;
          uStack_9f8 = 0;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_a38,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_1c0,this);
          bVar16 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_9e8,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_a38,&local_1c0);
          if (!bVar16) {
LAB_00441ded:
            puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_1898.data._M_elems._0_8_ = local_1898.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1898,"XMAISM05 This should never happen.","");
            *puVar20 = &PTR__SPxException_0069d438;
            puVar20[1] = puVar20 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar20 + 1),local_1898.data._M_elems._0_8_,
                       local_1898.data._M_elems._0_8_ + local_1898.data._M_elems._8_8_);
            *puVar20 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          local_a88.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
          local_a88.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
          local_a88.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
          local_a88.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
          local_a88.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
          local_a88.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 10);
          local_a88.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xc);
          local_a88.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xe);
          local_a88.m_backend.exp = (this->m_upK).m_backend.exp;
          local_a88.m_backend.neg = (this->m_upK).m_backend.neg;
          local_a88.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          local_a88.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
          local_a90 = 0x1000000000;
          local_ad8 = 0;
          uStack_ad0 = 0;
          local_ac8 = 0;
          uStack_ac0 = 0;
          local_ab8 = 0;
          uStack_ab0 = 0;
          local_aa8 = 0;
          uStack_aa0 = 0;
          uStack_a9b = 0;
          uStack_a98 = 0;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_ad8,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_210,this);
          bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_a88,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_ad8,&local_210);
          VVar21 = ZERO;
          if (!bVar16) goto LAB_00441ded;
        }
      }
    }
    cStatus->data[this->m_k] = VVar21;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)
               ((x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
    pnVar6 = &this->m_loJ;
    local_b28.m_backend.data._M_elems[0] = (this->m_loJ).m_backend.data._M_elems[0];
    local_b28.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_b28.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_b28.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_b28.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_b28.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_b28.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_b28.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_b28.m_backend.data._M_elems[8] = (this->m_loJ).m_backend.data._M_elems[8];
    local_b28.m_backend.data._M_elems[9] = (this->m_loJ).m_backend.data._M_elems[9];
    local_b28.m_backend.data._M_elems[10] = (this->m_loJ).m_backend.data._M_elems[10];
    local_b28.m_backend.data._M_elems[0xb] = (this->m_loJ).m_backend.data._M_elems[0xb];
    local_b28.m_backend.data._M_elems[0xc] = (this->m_loJ).m_backend.data._M_elems[0xc];
    local_b28.m_backend.data._M_elems[0xd] = (this->m_loJ).m_backend.data._M_elems[0xd];
    local_b28.m_backend.data._M_elems[0xe] = (this->m_loJ).m_backend.data._M_elems[0xe];
    local_b28.m_backend.data._M_elems[0xf] = (this->m_loJ).m_backend.data._M_elems[0xf];
    local_b28.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_b28.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_b28.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_b28.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_260,this);
    bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_b28,&local_260);
    if (bVar16) {
      local_b78.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_b78.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_b78.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_b78.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_b78.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_b78.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_b78.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_b78.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_b78.m_backend.data._M_elems[8] = (this->m_upJ).m_backend.data._M_elems[8];
      local_b78.m_backend.data._M_elems[9] = (this->m_upJ).m_backend.data._M_elems[9];
      local_b78.m_backend.data._M_elems[10] = (this->m_upJ).m_backend.data._M_elems[10];
      local_b78.m_backend.data._M_elems[0xb] = (this->m_upJ).m_backend.data._M_elems[0xb];
      local_b78.m_backend.data._M_elems[0xc] = (this->m_upJ).m_backend.data._M_elems[0xc];
      local_b78.m_backend.data._M_elems[0xd] = (this->m_upJ).m_backend.data._M_elems[0xd];
      local_b78.m_backend.data._M_elems[0xe] = (this->m_upJ).m_backend.data._M_elems[0xe];
      local_b78.m_backend.data._M_elems[0xf] = (this->m_upJ).m_backend.data._M_elems[0xf];
      local_b78.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_b78.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_b78.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_b78.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_2b0,this);
      bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_b78,&local_2b0);
      if (((bVar16) && ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN)) &&
         (((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN &&
          (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&pnVar6->m_backend,&(this->m_upJ).m_backend), iVar17 == 0)))) {
        cStatus->data[this->m_j] = FIXED;
        break;
      }
    }
    local_bc8.m_backend.data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
    local_bc8.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_bc8.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_bc8.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_bc8.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_bc8.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_bc8.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_bc8.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_bc8.m_backend.data._M_elems[8] = (this->m_loJ).m_backend.data._M_elems[8];
    local_bc8.m_backend.data._M_elems[9] = (this->m_loJ).m_backend.data._M_elems[9];
    local_bc8.m_backend.data._M_elems[10] = (this->m_loJ).m_backend.data._M_elems[10];
    local_bc8.m_backend.data._M_elems[0xb] = (this->m_loJ).m_backend.data._M_elems[0xb];
    local_bc8.m_backend.data._M_elems[0xc] = (this->m_loJ).m_backend.data._M_elems[0xc];
    local_bc8.m_backend.data._M_elems[0xd] = (this->m_loJ).m_backend.data._M_elems[0xd];
    local_bc8.m_backend.data._M_elems[0xe] = (this->m_loJ).m_backend.data._M_elems[0xe];
    local_bc8.m_backend.data._M_elems[0xf] = (this->m_loJ).m_backend.data._M_elems[0xf];
    local_bc8.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_bc8.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_bc8.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_bc8.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_300,this);
    bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_bc8,&local_300);
    if (bVar16) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      local_c18.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_c18.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_c18.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_c18.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_c18.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_c18.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_c18.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_c18.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_c18.m_backend.data._M_elems[8] = (this->m_upJ).m_backend.data._M_elems[8];
      local_c18.m_backend.data._M_elems[9] = (this->m_upJ).m_backend.data._M_elems[9];
      local_c18.m_backend.data._M_elems[10] = (this->m_upJ).m_backend.data._M_elems[10];
      local_c18.m_backend.data._M_elems[0xb] = (this->m_upJ).m_backend.data._M_elems[0xb];
      local_c18.m_backend.data._M_elems[0xc] = (this->m_upJ).m_backend.data._M_elems[0xc];
      local_c18.m_backend.data._M_elems[0xd] = (this->m_upJ).m_backend.data._M_elems[0xd];
      local_c18.m_backend.data._M_elems[0xe] = (this->m_upJ).m_backend.data._M_elems[0xe];
      local_c18.m_backend.data._M_elems[0xf] = (this->m_upJ).m_backend.data._M_elems[0xf];
      local_c18.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_c18.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_c18.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_c18.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_350,this);
      bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_c18,&local_350);
      if (!bVar16) {
        local_c68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar6->m_backend).data._M_elems;
        local_c68.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
        local_c68.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
        local_c68.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
        local_c68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
        local_c68.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 10);
        local_c68.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xc);
        local_c68.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xe);
        local_c68.m_backend.exp = (this->m_loJ).m_backend.exp;
        local_c68.m_backend.neg = (this->m_loJ).m_backend.neg;
        local_c68.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
        local_c68.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
        local_c70 = 0x1000000000;
        local_cb8 = 0;
        uStack_cb0 = 0;
        local_ca8 = 0;
        uStack_ca0 = 0;
        local_c98 = 0;
        uStack_c90 = 0;
        local_c88 = 0;
        uStack_c80 = 0;
        uStack_c7b = 0;
        uStack_c78 = 0;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_cb8,0.0);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_3a0,this);
        bVar16 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_c68,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_cb8,&local_3a0);
        if (bVar16) {
          local_d08.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
          local_d08.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
          local_d08.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
          local_d08.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
          local_d08.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
          local_d08.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 10);
          local_d08.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xc);
          local_d08.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xe);
          local_d08.m_backend.exp = (this->m_upJ).m_backend.exp;
          local_d08.m_backend.neg = (this->m_upJ).m_backend.neg;
          local_d08.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
          local_d08.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
          local_d10 = 0x1000000000;
          local_d58 = 0;
          uStack_d50 = 0;
          local_d48 = 0;
          uStack_d40 = 0;
          local_d38 = 0;
          uStack_d30 = 0;
          local_d28 = 0;
          uStack_d20 = 0;
          uStack_d1b = 0;
          uStack_d18 = 0;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_d58,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_3f0,this);
          bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_d08,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_d58,&local_3f0);
          if (bVar16) {
            cStatus->data[this->m_j] = ZERO;
            break;
          }
        }
        puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_1898.data._M_elems._0_8_ = local_1898.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1898,"XMAISM06 This should never happen.","");
        *puVar20 = &PTR__SPxException_0069d438;
        puVar20[1] = puVar20 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar20 + 1),local_1898.data._M_elems._0_8_,
                   local_1898.data._M_elems._0_8_ + local_1898.data._M_elems._8_8_);
        *puVar20 = &PTR__SPxException_0069d410;
        __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    break;
  case BASIC:
    pnVar6 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_da8 = *(undefined8 *)pnVar6[iVar17].m_backend.data._M_elems;
    uStack_da0 = *(undefined8 *)(pnVar6[iVar17].m_backend.data._M_elems + 2);
    puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 4;
    local_d98 = *(undefined8 *)puVar3;
    uStack_d90 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 8;
    local_d88 = *(undefined8 *)puVar3;
    uStack_d80 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 0xc;
    local_d78 = *(undefined8 *)puVar3;
    uStack_d70 = *(undefined8 *)(puVar3 + 2);
    local_d68 = pnVar6[iVar17].m_backend.exp;
    local_d64 = pnVar6[iVar17].m_backend.neg;
    local_d60._0_4_ = pnVar6[iVar17].m_backend.fpclass;
    local_d60._4_4_ = pnVar6[iVar17].m_backend.prec_elem;
    local_df8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_loK).m_backend.data._M_elems;
    local_df8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
    local_df8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
    local_df8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
    local_df8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    local_df8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 10);
    local_df8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xc);
    local_df8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xe);
    local_df8.m_backend.exp = (this->m_loK).m_backend.exp;
    local_df8.m_backend.neg = (this->m_loK).m_backend.neg;
    local_df8.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_df8.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_1898,(soplex *)&local_da8,&local_df8,pnVar6);
    iVar17 = this->m_k;
    pnVar6 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e48 = *(undefined8 *)pnVar6[iVar17].m_backend.data._M_elems;
    uStack_e40 = *(undefined8 *)(pnVar6[iVar17].m_backend.data._M_elems + 2);
    puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 4;
    local_e38 = *(undefined8 *)puVar3;
    uStack_e30 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 8;
    local_e28 = *(undefined8 *)puVar3;
    uStack_e20 = *(undefined8 *)(puVar3 + 2);
    puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 0xc;
    local_e18 = *(undefined8 *)puVar3;
    uStack_e10 = *(undefined8 *)(puVar3 + 2);
    local_e08 = pnVar6[iVar17].m_backend.exp;
    local_e04 = pnVar6[iVar17].m_backend.neg;
    local_e00._0_4_ = pnVar6[iVar17].m_backend.fpclass;
    local_e00._4_4_ = pnVar6[iVar17].m_backend.prec_elem;
    local_e98.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
    local_e98.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
    local_e98.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
    local_e98.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
    local_e98.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
    local_e98.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 10);
    local_e98.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xc);
    local_e98.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xe);
    local_e98.m_backend.exp = (this->m_upK).m_backend.exp;
    local_e98.m_backend.neg = (this->m_upK).m_backend.neg;
    local_e98.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    local_e98.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_17a8,(soplex *)&local_e48,&local_e98,pnVar6);
    local_17f8.data._M_elems[0] = 0;
    local_17f8.data._M_elems[1] = 0x3ff00000;
    tVar15 = boost::multiprecision::operator<
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1898,(double *)&local_17f8);
    if (tVar15) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1898,1.0);
    }
    pnVar6 = &this->m_loK;
    u = &this->m_upK;
    local_17f8.data._M_elems[0] = 0;
    local_17f8.data._M_elems[1] = 0x3ff00000;
    tVar15 = boost::multiprecision::operator<
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_17a8,(double *)&local_17f8);
    if (tVar15) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_17a8,1.0);
    }
    local_1848.fpclass = cpp_dec_float_finite;
    local_1848.prec_elem = 0x10;
    local_1848.data._M_elems[0] = 0;
    local_1848.data._M_elems[1] = 0;
    local_1848.data._M_elems[2] = 0;
    local_1848.data._M_elems[3] = 0;
    local_1848.data._M_elems[4] = 0;
    local_1848.data._M_elems[5] = 0;
    local_1848.data._M_elems[6] = 0;
    local_1848.data._M_elems[7] = 0;
    local_1848.data._M_elems[8] = 0;
    local_1848.data._M_elems[9] = 0;
    local_1848.data._M_elems[10] = 0;
    local_1848.data._M_elems[0xb] = 0;
    local_1848.data._M_elems[0xc] = 0;
    local_1848.data._M_elems[0xd] = 0;
    local_1848.data._M_elems[0xe] = 0;
    local_1848.data._M_elems[0xf] = 0;
    local_1848.exp = 0;
    local_1848.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_1848,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_1898);
    local_1958.fpclass = cpp_dec_float_finite;
    local_1958.prec_elem = 0x10;
    local_1958.data._M_elems[0] = 0;
    local_1958.data._M_elems[1] = 0;
    local_1958.data._M_elems[2] = 0;
    local_1958.data._M_elems[3] = 0;
    local_1958.data._M_elems[4] = 0;
    local_1958.data._M_elems[5] = 0;
    local_1958.data._M_elems[6] = 0;
    local_1958.data._M_elems[7] = 0;
    local_1958.data._M_elems[8] = 0;
    local_1958.data._M_elems[9] = 0;
    local_1958.data._M_elems[10] = 0;
    local_1958.data._M_elems[0xb] = 0;
    local_1958.data._M_elems[0xc] = 0;
    local_1958.data._M_elems[0xd] = 0;
    local_1958.data._M_elems._56_5_ = 0;
    local_1958.data._M_elems[0xf]._1_3_ = 0;
    local_1958.exp = 0;
    local_1958.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_1958,&pnVar6->m_backend,&local_1898);
    local_17f8.fpclass = cpp_dec_float_finite;
    local_17f8.prec_elem = 0x10;
    local_17f8.data._M_elems[0] = 0;
    local_17f8.data._M_elems[1] = 0;
    local_17f8.data._M_elems[2] = 0;
    local_17f8.data._M_elems[3] = 0;
    local_17f8.data._M_elems[4] = 0;
    local_17f8.data._M_elems[5] = 0;
    local_17f8.data._M_elems[6] = 0;
    local_17f8.data._M_elems[7] = 0;
    local_17f8.data._M_elems[8] = 0;
    local_17f8.data._M_elems[9] = 0;
    local_17f8.data._M_elems[10] = 0;
    local_17f8.data._M_elems[0xb] = 0;
    local_17f8.data._M_elems[0xc] = 0;
    local_17f8.data._M_elems[0xd] = 0;
    local_17f8.data._M_elems[0xe] = 0;
    local_17f8.data._M_elems[0xf] = 0;
    local_17f8.exp = 0;
    local_17f8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_17f8,&local_1848,&local_1958);
    local_1958.fpclass = cpp_dec_float_finite;
    local_1958.prec_elem = 0x10;
    local_1958.data._M_elems[0] = 0;
    local_1958.data._M_elems[1] = 0;
    local_1958.data._M_elems[2] = 0;
    local_1958.data._M_elems[3] = 0;
    local_1958.data._M_elems[4] = 0;
    local_1958.data._M_elems[5] = 0;
    local_1958.data._M_elems[6] = 0;
    local_1958.data._M_elems[7] = 0;
    local_1958.data._M_elems[8] = 0;
    local_1958.data._M_elems[9] = 0;
    local_1958.data._M_elems[10] = 0;
    local_1958.data._M_elems[0xb] = 0;
    local_1958.data._M_elems[0xc] = 0;
    local_1958.data._M_elems[0xd] = 0;
    local_1958.data._M_elems._56_5_ = 0;
    local_1958.data._M_elems[0xf]._1_3_ = 0;
    local_1958.exp = 0;
    local_1958.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_1958,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_17a8);
    local_18f8.fpclass = cpp_dec_float_finite;
    local_18f8.prec_elem = 0x10;
    local_18f8.data._M_elems[0] = 0;
    local_18f8.data._M_elems[1] = 0;
    local_18f8.data._M_elems[2] = 0;
    local_18f8.data._M_elems[3] = 0;
    local_18f8.data._M_elems[4] = 0;
    local_18f8.data._M_elems[5] = 0;
    local_18f8.data._M_elems[6] = 0;
    local_18f8.data._M_elems[7] = 0;
    local_18f8.data._M_elems[8] = 0;
    local_18f8.data._M_elems[9] = 0;
    local_18f8.data._M_elems[10] = 0;
    local_18f8.data._M_elems[0xb] = 0;
    local_18f8.data._M_elems[0xc] = 0;
    local_18f8.data._M_elems[0xd] = 0;
    local_18f8.data._M_elems._56_5_ = 0;
    local_18f8.data._M_elems[0xf]._1_3_ = 0;
    local_18f8.exp = 0;
    local_18f8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_18f8,&u->m_backend,&local_17a8);
    local_1848.fpclass = cpp_dec_float_finite;
    local_1848.prec_elem = 0x10;
    local_1848.data._M_elems[0] = 0;
    local_1848.data._M_elems[1] = 0;
    local_1848.data._M_elems[2] = 0;
    local_1848.data._M_elems[3] = 0;
    local_1848.data._M_elems[4] = 0;
    local_1848.data._M_elems[5] = 0;
    local_1848.data._M_elems[6] = 0;
    local_1848.data._M_elems[7] = 0;
    local_1848.data._M_elems[8] = 0;
    local_1848.data._M_elems[9] = 0;
    local_1848.data._M_elems[10] = 0;
    local_1848.data._M_elems[0xb] = 0;
    local_1848.data._M_elems[0xc] = 0;
    local_1848.data._M_elems[0xd] = 0;
    local_1848.data._M_elems[0xe] = 0;
    local_1848.data._M_elems[0xf] = 0;
    local_1848.exp = 0;
    local_1848.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_1848,&local_1958,&local_18f8);
    local_ee8.m_backend.data._M_elems[0] = local_17f8.data._M_elems[0];
    local_ee8.m_backend.data._M_elems[1] = local_17f8.data._M_elems[1];
    local_ee8.m_backend.data._M_elems[2] = local_17f8.data._M_elems[2];
    local_ee8.m_backend.data._M_elems[3] = local_17f8.data._M_elems[3];
    local_ee8.m_backend.data._M_elems[4] = local_17f8.data._M_elems[4];
    local_ee8.m_backend.data._M_elems[5] = local_17f8.data._M_elems[5];
    local_ee8.m_backend.data._M_elems[6] = local_17f8.data._M_elems[6];
    local_ee8.m_backend.data._M_elems[7] = local_17f8.data._M_elems[7];
    local_ee8.m_backend.data._M_elems[8] = local_17f8.data._M_elems[8];
    local_ee8.m_backend.data._M_elems[9] = local_17f8.data._M_elems[9];
    local_ee8.m_backend.data._M_elems[10] = local_17f8.data._M_elems[10];
    local_ee8.m_backend.data._M_elems[0xb] = local_17f8.data._M_elems[0xb];
    local_ee8.m_backend.data._M_elems[0xc] = local_17f8.data._M_elems[0xc];
    local_ee8.m_backend.data._M_elems[0xd] = local_17f8.data._M_elems[0xd];
    local_ee8.m_backend.data._M_elems[0xe] = local_17f8.data._M_elems[0xe];
    local_ee8.m_backend.data._M_elems[0xf] = local_17f8.data._M_elems[0xf];
    local_ee8.m_backend.exp = local_17f8.exp;
    local_ee8.m_backend.neg = local_17f8.neg;
    local_ee8.m_backend.fpclass = local_17f8.fpclass;
    local_ee8.m_backend.prec_elem = local_17f8.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_440,this);
    bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_ee8,&local_440);
    if (bVar16) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_17f8,0.0);
    }
    local_f38.m_backend.data._M_elems[0xc] = local_1848.data._M_elems[0xc];
    local_f38.m_backend.data._M_elems[0xd] = local_1848.data._M_elems[0xd];
    local_f38.m_backend.data._M_elems[0xe] = local_1848.data._M_elems[0xe];
    local_f38.m_backend.data._M_elems[0xf] = local_1848.data._M_elems[0xf];
    local_f38.m_backend.data._M_elems[8] = local_1848.data._M_elems[8];
    local_f38.m_backend.data._M_elems[9] = local_1848.data._M_elems[9];
    local_f38.m_backend.data._M_elems[10] = local_1848.data._M_elems[10];
    local_f38.m_backend.data._M_elems[0xb] = local_1848.data._M_elems[0xb];
    local_f38.m_backend.data._M_elems[4] = local_1848.data._M_elems[4];
    local_f38.m_backend.data._M_elems[5] = local_1848.data._M_elems[5];
    local_f38.m_backend.data._M_elems[6] = local_1848.data._M_elems[6];
    local_f38.m_backend.data._M_elems[7] = local_1848.data._M_elems[7];
    local_f38.m_backend.data._M_elems[0] = local_1848.data._M_elems[0];
    local_f38.m_backend.data._M_elems[1] = local_1848.data._M_elems[1];
    local_f38.m_backend.data._M_elems[2] = local_1848.data._M_elems[2];
    local_f38.m_backend.data._M_elems[3] = local_1848.data._M_elems[3];
    local_f38.m_backend.exp = local_1848.exp;
    local_f38.m_backend.neg = local_1848.neg;
    local_f38.m_backend.fpclass = local_1848.fpclass;
    local_f38.m_backend.prec_elem = local_1848.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_490,this);
    bVar16 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_f38,&local_490);
    if (bVar16) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1848,0.0);
    }
    ::soplex::infinity::__tls_init();
    this_00 = &this->m_loJ;
    local_1908 = *(double *)(in_FS_OFFSET + -8);
    local_18a8 = SUB84(local_1908,0);
    uStack_1900 = 0;
    uStack_18a4 = (uint)((ulong)local_1908 >> 0x20) ^ 0x80000000;
    local_1958.fpclass = cpp_dec_float_finite;
    local_1958.prec_elem = 0x10;
    local_1958.data._M_elems[0] = 0;
    local_1958.data._M_elems[1] = 0;
    local_1958.data._M_elems[2] = 0;
    local_1958.data._M_elems[3] = 0;
    local_1958.data._M_elems[4] = 0;
    local_1958.data._M_elems[5] = 0;
    local_1958.data._M_elems[6] = 0;
    local_1958.data._M_elems[7] = 0;
    local_1958.data._M_elems[8] = 0;
    local_1958.data._M_elems[9] = 0;
    local_1958.data._M_elems[10] = 0;
    local_1958.data._M_elems[0xb] = 0;
    local_1958.data._M_elems[0xc] = 0;
    local_1958.data._M_elems[0xd] = 0;
    local_1958.data._M_elems._56_5_ = 0;
    local_1958.data._M_elems[0xf]._1_3_ = 0;
    local_1958.exp = 0;
    local_1958.neg = false;
    uStack_18a0 = 0;
    uStack_189c = 0x80000000;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_1958,-local_1908);
    if ((((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_1958.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&this_00->m_backend,&local_1958), iVar17 < 1)) {
      ::soplex::infinity::__tls_init();
      local_18f8.fpclass = cpp_dec_float_finite;
      local_18f8.prec_elem = 0x10;
      local_18f8.data._M_elems[0] = 0;
      local_18f8.data._M_elems[1] = 0;
      local_18f8.data._M_elems[2] = 0;
      local_18f8.data._M_elems[3] = 0;
      local_18f8.data._M_elems[4] = 0;
      local_18f8.data._M_elems[5] = 0;
      local_18f8.data._M_elems[6] = 0;
      local_18f8.data._M_elems[7] = 0;
      local_18f8.data._M_elems[8] = 0;
      local_18f8.data._M_elems[9] = 0;
      local_18f8.data._M_elems[10] = 0;
      local_18f8.data._M_elems[0xb] = 0;
      local_18f8.data._M_elems[0xc] = 0;
      local_18f8.data._M_elems[0xd] = 0;
      local_18f8.data._M_elems._56_5_ = 0;
      local_18f8.data._M_elems[0xf]._1_3_ = 0;
      local_18f8.exp = 0;
      local_18f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_18f8,local_1908);
      if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_18f8.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&(this->m_upJ).m_backend,&local_18f8), -1 < iVar17)) {
        ::soplex::infinity::__tls_init();
        local_1708.fpclass = cpp_dec_float_finite;
        local_1708.prec_elem = 0x10;
        local_1708.data._M_elems[0] = 0;
        local_1708.data._M_elems[1] = 0;
        local_1708.data._M_elems[2] = 0;
        local_1708.data._M_elems[3] = 0;
        local_1708.data._M_elems[4] = 0;
        local_1708.data._M_elems[5] = 0;
        local_1708.data._M_elems[6] = 0;
        local_1708.data._M_elems[7] = 0;
        local_1708.data._M_elems[8] = 0;
        local_1708.data._M_elems[9] = 0;
        local_1708.data._M_elems[10] = 0;
        local_1708.data._M_elems[0xb] = 0;
        local_1708.data._M_elems[0xc] = 0;
        local_1708.data._M_elems[0xd] = 0;
        local_1708.data._M_elems._56_5_ = 0;
        local_1708.data._M_elems[0xf]._1_3_ = 0;
        local_1708.exp = 0;
        local_1708.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_1708,
                   (double)CONCAT44(uStack_18a4,local_18a8));
        if ((((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_1708.fpclass != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&pnVar6->m_backend,&local_1708), iVar17 < 1)) {
          ::soplex::infinity::__tls_init();
          local_1758.fpclass = cpp_dec_float_finite;
          local_1758.prec_elem = 0x10;
          local_1758.data._M_elems[0] = 0;
          local_1758.data._M_elems[1] = 0;
          local_1758.data._M_elems[2] = 0;
          local_1758.data._M_elems[3] = 0;
          local_1758.data._M_elems[4] = 0;
          local_1758.data._M_elems[5] = 0;
          local_1758.data._M_elems[6] = 0;
          local_1758.data._M_elems[7] = 0;
          local_1758.data._M_elems[8] = 0;
          local_1758.data._M_elems[9] = 0;
          local_1758.data._M_elems[10] = 0;
          local_1758.data._M_elems[0xb] = 0;
          local_1758.data._M_elems[0xc] = 0;
          local_1758.data._M_elems[0xd] = 0;
          local_1758.data._M_elems._56_5_ = 0;
          local_1758.data._M_elems[0xf]._1_3_ = 0;
          local_1758.exp = 0;
          local_1758.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_1758,local_1908);
          if ((((this->m_upK).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_1758.fpclass != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&u->m_backend,&local_1758), -1 < iVar17)) {
            iVar17 = this->m_j;
            cStatus->data[iVar17] = ZERO;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)
                       ((x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar17),0.0);
            break;
          }
        }
      }
    }
    u_00 = &this->m_scale;
    local_1958.data._M_elems[0] = 0;
    local_1958.data._M_elems[1] = 0;
    tVar15 = boost::multiprecision::operator>(u_00,(double *)&local_1958);
    pnVar22 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k;
    if (tVar15) {
      local_f88.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar22->m_backend).data;
      local_f88.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 2);
      local_f88.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 4);
      local_f88.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 6);
      local_f88.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 8);
      local_f88.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 10);
      local_f88.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 0xc);
      local_f88.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 0xe);
      local_f88.m_backend.exp = (pnVar22->m_backend).exp;
      local_f88.m_backend.neg = (pnVar22->m_backend).neg;
      local_f88.m_backend.fpclass = (pnVar22->m_backend).fpclass;
      local_f88.m_backend.prec_elem = (pnVar22->m_backend).prec_elem;
      pnVar1 = &this->m_upJ;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&pnVar1->m_backend);
      local_fd8.fpclass = cpp_dec_float_finite;
      local_fd8.prec_elem = 0x10;
      local_fd8.data._M_elems[0] = 0;
      local_fd8.data._M_elems[1] = 0;
      local_fd8.data._M_elems[2] = 0;
      local_fd8.data._M_elems[3] = 0;
      local_fd8.data._M_elems[4] = 0;
      local_fd8.data._M_elems[5] = 0;
      local_fd8.data._M_elems[6] = 0;
      local_fd8.data._M_elems[7] = 0;
      local_fd8.data._M_elems[8] = 0;
      local_fd8.data._M_elems[9] = 0;
      local_fd8.data._M_elems[10] = 0;
      local_fd8.data._M_elems[0xb] = 0;
      local_fd8.data._M_elems[0xc] = 0;
      local_fd8.data._M_elems[0xd] = 0;
      local_fd8.data._M_elems._56_5_ = 0;
      local_fd8.data._M_elems[0xf]._1_3_ = 0;
      local_fd8.exp = 0;
      local_fd8.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_fd8,&u->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_4e0,this);
      bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_f88,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_fd8,&local_4e0);
      if (bVar16) {
        if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) {
          VVar21 = ON_UPPER;
        }
        else {
          VVar21 = ON_UPPER;
          if ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) {
            iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&this_00->m_backend,&pnVar1->m_backend);
            VVar21 = (uint)(iVar17 == 0) * 2;
          }
        }
        iVar17 = this->m_j;
        cStatus->data[iVar17] = VVar21;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar18 = (long)iVar17 * 0x50;
        uVar28 = (pnVar1->m_backend).data._M_elems[0];
        uVar29 = (this->m_upJ).m_backend.data._M_elems[1];
        uVar30 = (this->m_upJ).m_backend.data._M_elems[2];
        uVar31 = (this->m_upJ).m_backend.data._M_elems[3];
        uVar32 = (this->m_upJ).m_backend.data._M_elems[4];
        uVar33 = (this->m_upJ).m_backend.data._M_elems[5];
        uVar34 = (this->m_upJ).m_backend.data._M_elems[6];
        uVar35 = (this->m_upJ).m_backend.data._M_elems[7];
        uVar36 = (this->m_upJ).m_backend.data._M_elems[8];
        uVar37 = (this->m_upJ).m_backend.data._M_elems[9];
        uVar38 = (this->m_upJ).m_backend.data._M_elems[10];
        uVar39 = (this->m_upJ).m_backend.data._M_elems[0xb];
        uVar40 = (this->m_upJ).m_backend.data._M_elems[0xc];
        uVar41 = (this->m_upJ).m_backend.data._M_elems[0xd];
        uVar42 = (this->m_upJ).m_backend.data._M_elems[0xe];
        uVar43 = (this->m_upJ).m_backend.data._M_elems[0xf];
LAB_00441877:
        puVar3 = (uint *)((long)(pnVar22->m_backend).data._M_elems + lVar18 + 0x30);
        *puVar3 = uVar40;
        puVar3[1] = uVar41;
        puVar3[2] = uVar42;
        puVar3[3] = uVar43;
        puVar3 = (uint *)((long)(pnVar22->m_backend).data._M_elems + lVar18 + 0x20);
        *puVar3 = uVar36;
        puVar3[1] = uVar37;
        puVar3[2] = uVar38;
        puVar3[3] = uVar39;
        puVar3 = (uint *)((long)(pnVar22->m_backend).data._M_elems + lVar18 + 0x10);
        *puVar3 = uVar32;
        puVar3[1] = uVar33;
        puVar3[2] = uVar34;
        puVar3[3] = uVar35;
        puVar3 = (uint *)((long)(pnVar22->m_backend).data._M_elems + lVar18);
        *puVar3 = uVar28;
        puVar3[1] = uVar29;
        puVar3[2] = uVar30;
        puVar3[3] = uVar31;
        *(int *)((long)(&(pnVar22->m_backend).data + 1) + lVar18) = (this->m_upJ).m_backend.exp;
        *(bool *)((long)(&(pnVar22->m_backend).data + 1) + lVar18 + 4U) =
             (this->m_upJ).m_backend.neg;
        uVar25._0_4_ = (this->m_upJ).m_backend.fpclass;
        uVar25._4_4_ = (this->m_upJ).m_backend.prec_elem;
      }
      else {
        iVar17 = this->m_k;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1028.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
        local_1028.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
        local_1028.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_1028.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
        local_1028.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
        local_1028.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
        local_1028.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
        local_1028.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
        local_1028.m_backend.exp = pnVar22[iVar17].m_backend.exp;
        local_1028.m_backend.neg = pnVar22[iVar17].m_backend.neg;
        local_1028.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
        local_1028.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
        local_1958.fpclass = cpp_dec_float_finite;
        local_1958.prec_elem = 0x10;
        local_1958.data._M_elems[0] = 0;
        local_1958.data._M_elems[1] = 0;
        local_1958.data._M_elems[2] = 0;
        local_1958.data._M_elems[3] = 0;
        local_1958.data._M_elems[4] = 0;
        local_1958.data._M_elems[5] = 0;
        local_1958.data._M_elems[6] = 0;
        local_1958.data._M_elems[7] = 0;
        local_1958.data._M_elems[8] = 0;
        local_1958.data._M_elems[9] = 0;
        local_1958.data._M_elems[10] = 0;
        local_1958.data._M_elems[0xb] = 0;
        local_1958.data._M_elems[0xc] = 0;
        local_1958.data._M_elems[0xd] = 0;
        local_1958.data._M_elems._56_5_ = 0;
        local_1958.data._M_elems[0xf]._1_3_ = 0;
        local_1958.exp = 0;
        local_1958.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_1958,&u_00->m_backend,&pnVar1->m_backend);
        local_1078.fpclass = cpp_dec_float_finite;
        local_1078.prec_elem = 0x10;
        local_1078.data._M_elems[0] = 0;
        local_1078.data._M_elems[1] = 0;
        local_1078.data._M_elems[2] = 0;
        local_1078.data._M_elems[3] = 0;
        local_1078.data._M_elems[4] = 0;
        local_1078.data._M_elems[5] = 0;
        local_1078.data._M_elems[6] = 0;
        local_1078.data._M_elems[7] = 0;
        local_1078.data._M_elems[8] = 0;
        local_1078.data._M_elems[9] = 0;
        local_1078.data._M_elems[10] = 0;
        local_1078.data._M_elems[0xb] = 0;
        local_1078.data._M_elems[0xc] = 0;
        local_1078.data._M_elems[0xd] = 0;
        local_1078.data._M_elems._56_5_ = 0;
        local_1078.data._M_elems[0xf]._1_3_ = 0;
        local_1078.exp = 0;
        local_1078.neg = false;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_1078,&pnVar6->m_backend,&local_1958);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_530,this);
        bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_1028,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1078,&local_530);
        if (bVar16) {
          ::soplex::infinity::__tls_init();
          local_18f8.fpclass = cpp_dec_float_finite;
          local_18f8.prec_elem = 0x10;
          local_18f8.data._M_elems[0] = 0;
          local_18f8.data._M_elems[1] = 0;
          local_18f8.data._M_elems[2] = 0;
          local_18f8.data._M_elems[3] = 0;
          local_18f8.data._M_elems[4] = 0;
          local_18f8.data._M_elems[5] = 0;
          local_18f8.data._M_elems[6] = 0;
          local_18f8.data._M_elems[7] = 0;
          local_18f8.data._M_elems[8] = 0;
          local_18f8.data._M_elems[9] = 0;
          local_18f8.data._M_elems[10] = 0;
          local_18f8.data._M_elems[0xb] = 0;
          local_18f8.data._M_elems[0xc] = 0;
          local_18f8.data._M_elems[0xd] = 0;
          local_18f8.data._M_elems._56_5_ = 0;
          local_18f8.data._M_elems[0xf]._1_3_ = 0;
          local_18f8.exp = 0;
          local_18f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_18f8,local_1908);
          if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_18f8.fpclass != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&pnVar1->m_backend,&local_18f8), iVar17 < 0)) {
            VVar21 = ON_UPPER;
            if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
               (VVar21 = ON_UPPER, (this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
              iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&this_00->m_backend,&pnVar1->m_backend);
              VVar21 = (uint)(iVar17 == 0) * 2;
            }
            iVar17 = this->m_j;
            cStatus->data[iVar17] = VVar21;
            pnVar22 = (x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar18 = (long)iVar17 * 0x50;
            uVar28 = (pnVar1->m_backend).data._M_elems[0];
            uVar29 = (this->m_upJ).m_backend.data._M_elems[1];
            uVar30 = (this->m_upJ).m_backend.data._M_elems[2];
            uVar31 = (this->m_upJ).m_backend.data._M_elems[3];
            uVar32 = (this->m_upJ).m_backend.data._M_elems[4];
            uVar33 = (this->m_upJ).m_backend.data._M_elems[5];
            uVar34 = (this->m_upJ).m_backend.data._M_elems[6];
            uVar35 = (this->m_upJ).m_backend.data._M_elems[7];
            uVar36 = (this->m_upJ).m_backend.data._M_elems[8];
            uVar37 = (this->m_upJ).m_backend.data._M_elems[9];
            uVar38 = (this->m_upJ).m_backend.data._M_elems[10];
            uVar39 = (this->m_upJ).m_backend.data._M_elems[0xb];
            uVar40 = (this->m_upJ).m_backend.data._M_elems[0xc];
            uVar41 = (this->m_upJ).m_backend.data._M_elems[0xd];
            uVar42 = (this->m_upJ).m_backend.data._M_elems[0xe];
            uVar43 = (this->m_upJ).m_backend.data._M_elems[0xf];
            goto LAB_00441877;
          }
        }
        iVar17 = this->m_k;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_10c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
        local_10c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
        local_10c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_10c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
        local_10c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
        local_10c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
        local_10c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
        local_10c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
        local_10c8.m_backend.exp = pnVar22[iVar17].m_backend.exp;
        local_10c8.m_backend.neg = pnVar22[iVar17].m_backend.neg;
        local_10c8.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
        local_10c8.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
        local_1958.fpclass = cpp_dec_float_finite;
        local_1958.prec_elem = 0x10;
        local_1958.data._M_elems[0] = 0;
        local_1958.data._M_elems[1] = 0;
        local_1958.data._M_elems[2] = 0;
        local_1958.data._M_elems[3] = 0;
        local_1958.data._M_elems[4] = 0;
        local_1958.data._M_elems[5] = 0;
        local_1958.data._M_elems[6] = 0;
        local_1958.data._M_elems[7] = 0;
        local_1958.data._M_elems[8] = 0;
        local_1958.data._M_elems[9] = 0;
        local_1958.data._M_elems[10] = 0;
        local_1958.data._M_elems[0xb] = 0;
        local_1958.data._M_elems[0xc] = 0;
        local_1958.data._M_elems[0xd] = 0;
        local_1958.data._M_elems._56_5_ = 0;
        local_1958.data._M_elems[0xf]._1_3_ = 0;
        local_1958.exp = 0;
        local_1958.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_1958,&u_00->m_backend,&this_00->m_backend);
        local_1118.fpclass = cpp_dec_float_finite;
        local_1118.prec_elem = 0x10;
        local_1118.data._M_elems[0] = 0;
        local_1118.data._M_elems[1] = 0;
        local_1118.data._M_elems[2] = 0;
        local_1118.data._M_elems[3] = 0;
        local_1118.data._M_elems[4] = 0;
        local_1118.data._M_elems[5] = 0;
        local_1118.data._M_elems[6] = 0;
        local_1118.data._M_elems[7] = 0;
        local_1118.data._M_elems[8] = 0;
        local_1118.data._M_elems[9] = 0;
        local_1118.data._M_elems[10] = 0;
        local_1118.data._M_elems[0xb] = 0;
        local_1118.data._M_elems[0xc] = 0;
        local_1118.data._M_elems[0xd] = 0;
        local_1118.data._M_elems._56_5_ = 0;
        local_1118.data._M_elems[0xf]._1_3_ = 0;
        local_1118.exp = 0;
        local_1118.neg = false;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_1118,&u->m_backend,&local_1958);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_580,this);
        bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_10c8,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1118,&local_580);
        if (bVar16) {
          ::soplex::infinity::__tls_init();
          local_18f8.fpclass = cpp_dec_float_finite;
          local_18f8.prec_elem = 0x10;
          local_18f8.data._M_elems[0] = 0;
          local_18f8.data._M_elems[1] = 0;
          local_18f8.data._M_elems[2] = 0;
          local_18f8.data._M_elems[3] = 0;
          local_18f8.data._M_elems[4] = 0;
          local_18f8.data._M_elems[5] = 0;
          local_18f8.data._M_elems[6] = 0;
          local_18f8.data._M_elems[7] = 0;
          local_18f8.data._M_elems[8] = 0;
          local_18f8.data._M_elems[9] = 0;
          local_18f8.data._M_elems[10] = 0;
          local_18f8.data._M_elems[0xb] = 0;
          local_18f8.data._M_elems[0xc] = 0;
          local_18f8.data._M_elems[0xd] = 0;
          local_18f8.data._M_elems._56_5_ = 0;
          local_18f8.data._M_elems[0xf]._1_3_ = 0;
          local_18f8.exp = 0;
          local_18f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_18f8,local_1908);
          if ((((this->m_upK).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_18f8.fpclass == cpp_dec_float_NaN)) ||
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&u->m_backend,&local_18f8), -1 < iVar17)) goto LAB_00440e62;
LAB_00440e0e:
          VVar21 = ON_UPPER;
          if (((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
             (VVar21 = ON_UPPER, (this->m_upK).m_backend.fpclass != cpp_dec_float_NaN)) {
            iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&pnVar6->m_backend,&u->m_backend);
            VVar21 = (uint)(iVar17 == 0) * 2;
          }
          iVar17 = this->m_k;
          cStatus->data[iVar17] = VVar21;
          pnVar22 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar25 = *(undefined8 *)(u->m_backend).data._M_elems;
          uVar8 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
          uVar9 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
          uVar10 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
          uVar11 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
          uVar12 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 10);
          uVar13 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xe);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar3 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xc);
          *(undefined8 *)(puVar3 + 2) = uVar13;
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = uVar11;
          *(undefined8 *)(puVar3 + 2) = uVar12;
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = uVar9;
          *(undefined8 *)(puVar3 + 2) = uVar10;
          *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
          *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
          pnVar22[iVar17].m_backend.exp = (this->m_upK).m_backend.exp;
          pnVar22[iVar17].m_backend.neg = (this->m_upK).m_backend.neg;
          iVar14 = (this->m_upK).m_backend.prec_elem;
          pnVar22[iVar17].m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          pnVar22[iVar17].m_backend.prec_elem = iVar14;
          cStatus->data[this->m_j] = BASIC;
          local_18f8.data._M_elems[0xc] = local_1848.data._M_elems[0xc];
          local_18f8.data._M_elems[0xd] = local_1848.data._M_elems[0xd];
          local_18f8.data._M_elems._56_5_ =
               SUB85(CONCAT44(local_1848.data._M_elems[0xf],local_1848.data._M_elems[0xe]),0);
          local_18f8.data._M_elems[0xf]._1_3_ = (undefined3)(local_1848.data._M_elems[0xf] >> 8);
          local_18f8.data._M_elems[8] = local_1848.data._M_elems[8];
          local_18f8.data._M_elems[9] = local_1848.data._M_elems[9];
          local_18f8.data._M_elems[10] = local_1848.data._M_elems[10];
          local_18f8.data._M_elems[0xb] = local_1848.data._M_elems[0xb];
          local_18f8.data._M_elems[4] = local_1848.data._M_elems[4];
          local_18f8.data._M_elems[5] = local_1848.data._M_elems[5];
          local_18f8.data._M_elems[6] = local_1848.data._M_elems[6];
          local_18f8.data._M_elems[7] = local_1848.data._M_elems[7];
          local_18f8.data._M_elems[0] = local_1848.data._M_elems[0];
          local_18f8.data._M_elems[1] = local_1848.data._M_elems[1];
          local_18f8.data._M_elems[2] = local_1848.data._M_elems[2];
          local_18f8.data._M_elems[3] = local_1848.data._M_elems[3];
          local_18f8.exp = local_1848.exp;
          local_18f8.neg = local_1848.neg;
          local_18f8.fpclass = local_1848.fpclass;
          local_18f8.prec_elem = local_1848.prec_elem;
          pcVar26 = &local_17a8;
LAB_00441cdc:
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    (&local_18f8,pcVar26);
          local_1958.fpclass = cpp_dec_float_finite;
          local_1958.prec_elem = 0x10;
          local_1958.data._M_elems[0] = 0;
          local_1958.data._M_elems[1] = 0;
          local_1958.data._M_elems[2] = 0;
          local_1958.data._M_elems[3] = 0;
          local_1958.data._M_elems[4] = 0;
          local_1958.data._M_elems[5] = 0;
          local_1958.data._M_elems[6] = 0;
          local_1958.data._M_elems[7] = 0;
          local_1958.data._M_elems[8] = 0;
          local_1958.data._M_elems[9] = 0;
          local_1958.data._M_elems[10] = 0;
          local_1958.data._M_elems[0xb] = 0;
          local_1958.data._M_elems[0xc] = 0;
          local_1958.data._M_elems[0xd] = 0;
          local_1958.data._M_elems._56_5_ = 0;
          local_1958.data._M_elems[0xf]._1_3_ = 0;
          local_1958.exp = 0;
          local_1958.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_1958,&local_18f8,&u_00->m_backend);
          iVar17 = this->m_j;
          pnVar22 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar3 = local_1958.data._M_elems._48_8_;
          *(ulong *)(puVar3 + 2) =
               CONCAT35(local_1958.data._M_elems[0xf]._1_3_,local_1958.data._M_elems._56_5_);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar3 = local_1958.data._M_elems._32_8_;
          *(undefined8 *)(puVar3 + 2) = local_1958.data._M_elems._40_8_;
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = local_1958.data._M_elems._16_8_;
          *(undefined8 *)(puVar3 + 2) = local_1958.data._M_elems._24_8_;
          *(undefined8 *)&pnVar22[iVar17].m_backend.data = local_1958.data._M_elems._0_8_;
          *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) =
               local_1958.data._M_elems._8_8_;
          pnVar22[iVar17].m_backend.exp = local_1958.exp;
          pnVar22[iVar17].m_backend.neg = local_1958.neg;
          pnVar22[iVar17].m_backend.fpclass = local_1958.fpclass;
          pnVar22[iVar17].m_backend.prec_elem = local_1958.prec_elem;
          break;
        }
LAB_00440e62:
        iVar17 = this->m_k;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
        local_1168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
        local_1168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_1168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
        local_1168.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
        local_1168.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
        local_1168.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
        local_1168.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
        local_1168.m_backend.exp = pnVar22[iVar17].m_backend.exp;
        local_1168.m_backend.neg = pnVar22[iVar17].m_backend.neg;
        local_1168.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
        local_1168.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
        local_1958.fpclass = cpp_dec_float_finite;
        local_1958.prec_elem = 0x10;
        local_1958.data._M_elems[0] = 0;
        local_1958.data._M_elems[1] = 0;
        local_1958.data._M_elems[2] = 0;
        local_1958.data._M_elems[3] = 0;
        local_1958.data._M_elems[4] = 0;
        local_1958.data._M_elems[5] = 0;
        local_1958.data._M_elems[6] = 0;
        local_1958.data._M_elems[7] = 0;
        local_1958.data._M_elems[8] = 0;
        local_1958.data._M_elems[9] = 0;
        local_1958.data._M_elems[10] = 0;
        local_1958.data._M_elems[0xb] = 0;
        local_1958.data._M_elems[0xc] = 0;
        local_1958.data._M_elems[0xd] = 0;
        local_1958.data._M_elems._56_5_ = 0;
        local_1958.data._M_elems[0xf]._1_3_ = 0;
        local_1958.exp = 0;
        local_1958.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_1958,&u_00->m_backend,&this_00->m_backend);
        local_11b8.fpclass = cpp_dec_float_finite;
        local_11b8.prec_elem = 0x10;
        local_11b8.data._M_elems[0] = 0;
        local_11b8.data._M_elems[1] = 0;
        local_11b8.data._M_elems[2] = 0;
        local_11b8.data._M_elems[3] = 0;
        local_11b8.data._M_elems[4] = 0;
        local_11b8.data._M_elems[5] = 0;
        local_11b8.data._M_elems[6] = 0;
        local_11b8.data._M_elems[7] = 0;
        local_11b8.data._M_elems[8] = 0;
        local_11b8.data._M_elems[9] = 0;
        local_11b8.data._M_elems[10] = 0;
        local_11b8.data._M_elems[0xb] = 0;
        local_11b8.data._M_elems[0xc] = 0;
        local_11b8.data._M_elems[0xd] = 0;
        local_11b8.data._M_elems._56_5_ = 0;
        local_11b8.data._M_elems[0xf]._1_3_ = 0;
        local_11b8.exp = 0;
        local_11b8.neg = false;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_11b8,&pnVar6->m_backend,&local_1958);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_5d0,this);
        bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_1168,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_11b8,&local_5d0);
        if (bVar16) {
          ::soplex::infinity::__tls_init();
          local_18f8.fpclass = cpp_dec_float_finite;
          local_18f8.prec_elem = 0x10;
          local_18f8.data._M_elems[0] = 0;
          local_18f8.data._M_elems[1] = 0;
          local_18f8.data._M_elems[2] = 0;
          local_18f8.data._M_elems[3] = 0;
          local_18f8.data._M_elems[4] = 0;
          local_18f8.data._M_elems[5] = 0;
          local_18f8.data._M_elems[6] = 0;
          local_18f8.data._M_elems[7] = 0;
          local_18f8.data._M_elems[8] = 0;
          local_18f8.data._M_elems[9] = 0;
          local_18f8.data._M_elems[10] = 0;
          local_18f8.data._M_elems[0xb] = 0;
          local_18f8.data._M_elems[0xc] = 0;
          local_18f8.data._M_elems[0xd] = 0;
          local_18f8.data._M_elems._56_5_ = 0;
          local_18f8.data._M_elems[0xf]._1_3_ = 0;
          local_18f8.exp = 0;
          local_18f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_18f8,
                     (double)CONCAT44(uStack_18a4,local_18a8));
          if ((((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_18f8.fpclass == cpp_dec_float_NaN)) ||
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&this_00->m_backend,&local_18f8), iVar17 < 1)) goto LAB_004411d2;
          if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_004418fd;
          fVar4 = (this->m_upJ).m_backend.fpclass;
LAB_00441659:
          VVar21 = ON_LOWER;
          if (fVar4 != cpp_dec_float_NaN) goto LAB_0044166c;
        }
        else {
LAB_004411d2:
          iVar17 = this->m_k;
          pnVar22 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1208.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
          local_1208.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
          local_1208.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_1208.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
          local_1208.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
          local_1208.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
          local_1208.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
          local_1208.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
          local_1208.m_backend.exp = pnVar22[iVar17].m_backend.exp;
          local_1208.m_backend.neg = pnVar22[iVar17].m_backend.neg;
          local_1208.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
          local_1208.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
          local_1958.fpclass = cpp_dec_float_finite;
          local_1958.prec_elem = 0x10;
          local_1958.data._M_elems[0] = 0;
          local_1958.data._M_elems[1] = 0;
          local_1958.data._M_elems[2] = 0;
          local_1958.data._M_elems[3] = 0;
          local_1958.data._M_elems[4] = 0;
          local_1958.data._M_elems[5] = 0;
          local_1958.data._M_elems[6] = 0;
          local_1958.data._M_elems[7] = 0;
          local_1958.data._M_elems[8] = 0;
          local_1958.data._M_elems[9] = 0;
          local_1958.data._M_elems[10] = 0;
          local_1958.data._M_elems[0xb] = 0;
          local_1958.data._M_elems[0xc] = 0;
          local_1958.data._M_elems[0xd] = 0;
          local_1958.data._M_elems._56_5_ = 0;
          local_1958.data._M_elems[0xf]._1_3_ = 0;
          local_1958.exp = 0;
          local_1958.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_1958,&u_00->m_backend,&this_00->m_backend);
          local_1258.fpclass = cpp_dec_float_finite;
          local_1258.prec_elem = 0x10;
          local_1258.data._M_elems[0] = 0;
          local_1258.data._M_elems[1] = 0;
          local_1258.data._M_elems[2] = 0;
          local_1258.data._M_elems[3] = 0;
          local_1258.data._M_elems[4] = 0;
          local_1258.data._M_elems[5] = 0;
          local_1258.data._M_elems[6] = 0;
          local_1258.data._M_elems[7] = 0;
          local_1258.data._M_elems[8] = 0;
          local_1258.data._M_elems[9] = 0;
          local_1258.data._M_elems[10] = 0;
          local_1258.data._M_elems[0xb] = 0;
          local_1258.data._M_elems[0xc] = 0;
          local_1258.data._M_elems[0xd] = 0;
          local_1258.data._M_elems._56_5_ = 0;
          local_1258.data._M_elems[0xf]._1_3_ = 0;
          local_1258.exp = 0;
          local_1258.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_1258,&pnVar6->m_backend,&local_1958);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_620,this);
          bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_1208,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1258,&local_620);
          if (bVar16) {
            ::soplex::infinity::__tls_init();
            local_18f8.fpclass = cpp_dec_float_finite;
            local_18f8.prec_elem = 0x10;
            local_18f8.data._M_elems[0] = 0;
            local_18f8.data._M_elems[1] = 0;
            local_18f8.data._M_elems[2] = 0;
            local_18f8.data._M_elems[3] = 0;
            local_18f8.data._M_elems[4] = 0;
            local_18f8.data._M_elems[5] = 0;
            local_18f8.data._M_elems[6] = 0;
            local_18f8.data._M_elems[7] = 0;
            local_18f8.data._M_elems[8] = 0;
            local_18f8.data._M_elems[9] = 0;
            local_18f8.data._M_elems[10] = 0;
            local_18f8.data._M_elems[0xb] = 0;
            local_18f8.data._M_elems[0xc] = 0;
            local_18f8.data._M_elems[0xd] = 0;
            local_18f8.data._M_elems._56_5_ = 0;
            local_18f8.data._M_elems[0xf]._1_3_ = 0;
            local_18f8.exp = 0;
            local_18f8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_18f8,
                       (double)CONCAT44(uStack_18a4,local_18a8));
            if ((((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
                (local_18f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&pnVar6->m_backend,&local_18f8), 0 < iVar17)) {
              if ((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_00441bfd;
              fVar4 = (this->m_upK).m_backend.fpclass;
LAB_00441512:
              VVar21 = ON_LOWER;
              if (fVar4 != cpp_dec_float_NaN) {
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&pnVar6->m_backend,&u->m_backend);
                VVar21 = (iVar17 == 0) + ON_LOWER;
              }
              goto LAB_00441c02;
            }
          }
          iVar17 = this->m_k;
          pnVar22 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_12a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
          local_12a8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
          local_12a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_12a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
          local_12a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
          local_12a8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
          puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
          local_12a8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
          local_12a8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
          local_12a8.m_backend.exp = pnVar22[iVar17].m_backend.exp;
          local_12a8.m_backend.neg = pnVar22[iVar17].m_backend.neg;
          local_12a8.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
          local_12a8.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
          local_1958.fpclass = cpp_dec_float_finite;
          local_1958.prec_elem = 0x10;
          local_1958.data._M_elems[0] = 0;
          local_1958.data._M_elems[1] = 0;
          local_1958.data._M_elems[2] = 0;
          local_1958.data._M_elems[3] = 0;
          local_1958.data._M_elems[4] = 0;
          local_1958.data._M_elems[5] = 0;
          local_1958.data._M_elems[6] = 0;
          local_1958.data._M_elems[7] = 0;
          local_1958.data._M_elems[8] = 0;
          local_1958.data._M_elems[9] = 0;
          local_1958.data._M_elems[10] = 0;
          local_1958.data._M_elems[0xb] = 0;
          local_1958.data._M_elems[0xc] = 0;
          local_1958.data._M_elems[0xd] = 0;
          local_1958.data._M_elems._56_5_ = 0;
          local_1958.data._M_elems[0xf]._1_3_ = 0;
          local_1958.exp = 0;
          local_1958.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_1958,&u_00->m_backend,&this_00->m_backend);
          local_12f8.fpclass = cpp_dec_float_finite;
          local_12f8.prec_elem = 0x10;
          local_12f8.data._M_elems[0] = 0;
          local_12f8.data._M_elems[1] = 0;
          local_12f8.data._M_elems[2] = 0;
          local_12f8.data._M_elems[3] = 0;
          local_12f8.data._M_elems[4] = 0;
          local_12f8.data._M_elems[5] = 0;
          local_12f8.data._M_elems[6] = 0;
          local_12f8.data._M_elems[7] = 0;
          local_12f8.data._M_elems[8] = 0;
          local_12f8.data._M_elems[9] = 0;
          local_12f8.data._M_elems[10] = 0;
          local_12f8.data._M_elems[0xb] = 0;
          local_12f8.data._M_elems[0xc] = 0;
          local_12f8.data._M_elems[0xd] = 0;
          local_12f8.data._M_elems._56_5_ = 0;
          local_12f8.data._M_elems[0xf]._1_3_ = 0;
          local_12f8.exp = 0;
          local_12f8.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_12f8,&pnVar6->m_backend,&local_1958);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_670,this);
          bVar16 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_12a8,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_12f8,&local_670);
          if (!bVar16) {
            puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_1958.data._M_elems._0_8_ = local_1958.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1958,"XMAISM08 This should never happen.","");
            *puVar20 = &PTR__SPxException_0069d438;
            puVar20[1] = puVar20 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar20 + 1),local_1958.data._M_elems._0_8_,
                       (undefined1 *)
                       (local_1958.data._M_elems._0_8_ + local_1958.data._M_elems._8_8_));
            *puVar20 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
            fVar4 = (this->m_upJ).m_backend.fpclass;
            goto LAB_00441659;
          }
LAB_004418fd:
          VVar21 = ON_LOWER;
        }
LAB_00441902:
        iVar17 = this->m_j;
        pVVar24 = cStatus->data;
LAB_0044190a:
        lVar23 = (long)iVar17;
        pVVar24[lVar23] = VVar21;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar18 = lVar23 * 0x50;
        uVar25 = *(undefined8 *)(this_00->m_backend).data._M_elems;
        uVar8 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
        uVar9 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
        uVar10 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
        uVar11 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
        uVar12 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 10);
        uVar13 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xe);
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar3 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xc);
        *(undefined8 *)(puVar3 + 2) = uVar13;
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar3 = uVar11;
        *(undefined8 *)(puVar3 + 2) = uVar12;
        puVar3 = pnVar22[lVar23].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = uVar9;
        *(undefined8 *)(puVar3 + 2) = uVar10;
        *(undefined8 *)&pnVar22[lVar23].m_backend.data = uVar25;
        *(undefined8 *)(pnVar22[lVar23].m_backend.data._M_elems + 2) = uVar8;
        pnVar22[lVar23].m_backend.exp = (this->m_loJ).m_backend.exp;
        pnVar22[lVar23].m_backend.neg = (this->m_loJ).m_backend.neg;
        uVar25._0_4_ = (this->m_loJ).m_backend.fpclass;
        uVar25._4_4_ = (this->m_loJ).m_backend.prec_elem;
      }
      *(undefined8 *)((long)(&(pnVar22->m_backend).data + 1) + lVar18 + 8U) = uVar25;
      pcVar26 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    }
    else {
      local_1348.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar22->m_backend).data;
      local_1348.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 2);
      local_1348.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 4);
      local_1348.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 6);
      local_1348.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 8);
      local_1348.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 10);
      local_1348.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 0xc);
      local_1348.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((pnVar22->m_backend).data._M_elems + 0xe);
      local_1348.m_backend.exp = (pnVar22->m_backend).exp;
      local_1348.m_backend.neg = (pnVar22->m_backend).neg;
      local_1348.m_backend.fpclass = (pnVar22->m_backend).fpclass;
      local_1348.m_backend.prec_elem = (pnVar22->m_backend).prec_elem;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&this_00->m_backend);
      local_1398.fpclass = cpp_dec_float_finite;
      local_1398.prec_elem = 0x10;
      local_1398.data._M_elems[0] = 0;
      local_1398.data._M_elems[1] = 0;
      local_1398.data._M_elems[2] = 0;
      local_1398.data._M_elems[3] = 0;
      local_1398.data._M_elems[4] = 0;
      local_1398.data._M_elems[5] = 0;
      local_1398.data._M_elems[6] = 0;
      local_1398.data._M_elems[7] = 0;
      local_1398.data._M_elems[8] = 0;
      local_1398.data._M_elems[9] = 0;
      local_1398.data._M_elems[10] = 0;
      local_1398.data._M_elems[0xb] = 0;
      local_1398.data._M_elems[0xc] = 0;
      local_1398.data._M_elems[0xd] = 0;
      local_1398.data._M_elems._56_5_ = 0;
      local_1398.data._M_elems[0xf]._1_3_ = 0;
      local_1398.exp = 0;
      local_1398.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1398,&u->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_6c0,this);
      bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1348,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1398,&local_6c0);
      if (bVar16) {
        VVar21 = ON_LOWER;
        if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
           ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&this_00->m_backend,&(this->m_upJ).m_backend);
          VVar21 = (iVar17 == 0) + ON_LOWER;
        }
        iVar17 = this->m_j;
        pVVar24 = cStatus->data;
        goto LAB_0044190a;
      }
      iVar17 = this->m_k;
      pnVar22 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_13e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
      local_13e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
      local_13e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_13e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
      local_13e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
      local_13e8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
      local_13e8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
      local_13e8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
      local_13e8.m_backend.exp = pnVar22[iVar17].m_backend.exp;
      local_13e8.m_backend.neg = pnVar22[iVar17].m_backend.neg;
      local_13e8.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
      local_13e8.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&this_00->m_backend);
      local_1438.fpclass = cpp_dec_float_finite;
      local_1438.prec_elem = 0x10;
      local_1438.data._M_elems[0] = 0;
      local_1438.data._M_elems[1] = 0;
      local_1438.data._M_elems[2] = 0;
      local_1438.data._M_elems[3] = 0;
      local_1438.data._M_elems[4] = 0;
      local_1438.data._M_elems[5] = 0;
      local_1438.data._M_elems[6] = 0;
      local_1438.data._M_elems[7] = 0;
      local_1438.data._M_elems[8] = 0;
      local_1438.data._M_elems[9] = 0;
      local_1438.data._M_elems[10] = 0;
      local_1438.data._M_elems[0xb] = 0;
      local_1438.data._M_elems[0xc] = 0;
      local_1438.data._M_elems[0xd] = 0;
      local_1438.data._M_elems._56_5_ = 0;
      local_1438.data._M_elems[0xf]._1_3_ = 0;
      local_1438.exp = 0;
      local_1438.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1438,&pnVar6->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_710,this);
      bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_13e8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1438,&local_710);
      if (bVar16) {
        ::soplex::infinity::__tls_init();
        local_18f8.fpclass = cpp_dec_float_finite;
        local_18f8.prec_elem = 0x10;
        local_18f8.data._M_elems[0] = 0;
        local_18f8.data._M_elems[1] = 0;
        local_18f8.data._M_elems[2] = 0;
        local_18f8.data._M_elems[3] = 0;
        local_18f8.data._M_elems[4] = 0;
        local_18f8.data._M_elems[5] = 0;
        local_18f8.data._M_elems[6] = 0;
        local_18f8.data._M_elems[7] = 0;
        local_18f8.data._M_elems[8] = 0;
        local_18f8.data._M_elems[9] = 0;
        local_18f8.data._M_elems[10] = 0;
        local_18f8.data._M_elems[0xb] = 0;
        local_18f8.data._M_elems[0xc] = 0;
        local_18f8.data._M_elems[0xd] = 0;
        local_18f8.data._M_elems._56_5_ = 0;
        local_18f8.data._M_elems[0xf]._1_3_ = 0;
        local_18f8.exp = 0;
        local_18f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_18f8,
                   (double)CONCAT44(uStack_18a4,local_18a8));
        if ((((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) ||
            (local_18f8.fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&this_00->m_backend,&local_18f8), iVar17 < 1)) goto LAB_00440c91;
        VVar21 = ON_LOWER;
        if (((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) ||
           ((this->m_upJ).m_backend.fpclass == cpp_dec_float_NaN)) goto LAB_00441902;
LAB_0044166c:
        iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&this_00->m_backend,&(this->m_upJ).m_backend);
        VVar21 = (iVar17 == 0) + ON_LOWER;
        goto LAB_00441902;
      }
LAB_00440c91:
      iVar17 = this->m_k;
      pnVar22 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1488.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
      local_1488.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
      local_1488.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_1488.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
      local_1488.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
      local_1488.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
      local_1488.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
      local_1488.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
      local_1488.m_backend.exp = pnVar22[iVar17].m_backend.exp;
      local_1488.m_backend.neg = pnVar22[iVar17].m_backend.neg;
      local_1488.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
      local_1488.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
      pnVar1 = &this->m_upJ;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&pnVar1->m_backend);
      local_14d8.fpclass = cpp_dec_float_finite;
      local_14d8.prec_elem = 0x10;
      local_14d8.data._M_elems[0] = 0;
      local_14d8.data._M_elems[1] = 0;
      local_14d8.data._M_elems[2] = 0;
      local_14d8.data._M_elems[3] = 0;
      local_14d8.data._M_elems[4] = 0;
      local_14d8.data._M_elems[5] = 0;
      local_14d8.data._M_elems[6] = 0;
      local_14d8.data._M_elems[7] = 0;
      local_14d8.data._M_elems[8] = 0;
      local_14d8.data._M_elems[9] = 0;
      local_14d8.data._M_elems[10] = 0;
      local_14d8.data._M_elems[0xb] = 0;
      local_14d8.data._M_elems[0xc] = 0;
      local_14d8.data._M_elems[0xd] = 0;
      local_14d8.data._M_elems._56_5_ = 0;
      local_14d8.data._M_elems[0xf]._1_3_ = 0;
      local_14d8.exp = 0;
      local_14d8.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_14d8,&u->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_760,this);
      bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1488,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_14d8,&local_760);
      if (bVar16) {
        ::soplex::infinity::__tls_init();
        local_18f8.fpclass = cpp_dec_float_finite;
        local_18f8.prec_elem = 0x10;
        local_18f8.data._M_elems[0] = 0;
        local_18f8.data._M_elems[1] = 0;
        local_18f8.data._M_elems[2] = 0;
        local_18f8.data._M_elems[3] = 0;
        local_18f8.data._M_elems[4] = 0;
        local_18f8.data._M_elems[5] = 0;
        local_18f8.data._M_elems[6] = 0;
        local_18f8.data._M_elems[7] = 0;
        local_18f8.data._M_elems[8] = 0;
        local_18f8.data._M_elems[9] = 0;
        local_18f8.data._M_elems[10] = 0;
        local_18f8.data._M_elems[0xb] = 0;
        local_18f8.data._M_elems[0xc] = 0;
        local_18f8.data._M_elems[0xd] = 0;
        local_18f8.data._M_elems._56_5_ = 0;
        local_18f8.data._M_elems[0xf]._1_3_ = 0;
        local_18f8.exp = 0;
        local_18f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_18f8,local_1908);
        if ((((this->m_upK).m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_18f8.fpclass != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&u->m_backend,&local_18f8), iVar17 < 0)) goto LAB_00440e0e;
      }
      iVar17 = this->m_k;
      pnVar22 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1528.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
      local_1528.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
      local_1528.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_1528.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
      local_1528.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
      local_1528.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
      local_1528.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
      local_1528.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
      local_1528.m_backend.exp = pnVar22[iVar17].m_backend.exp;
      local_1528.m_backend.neg = pnVar22[iVar17].m_backend.neg;
      local_1528.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
      local_1528.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&pnVar1->m_backend);
      local_1578.fpclass = cpp_dec_float_finite;
      local_1578.prec_elem = 0x10;
      local_1578.data._M_elems[0] = 0;
      local_1578.data._M_elems[1] = 0;
      local_1578.data._M_elems[2] = 0;
      local_1578.data._M_elems[3] = 0;
      local_1578.data._M_elems[4] = 0;
      local_1578.data._M_elems[5] = 0;
      local_1578.data._M_elems[6] = 0;
      local_1578.data._M_elems[7] = 0;
      local_1578.data._M_elems[8] = 0;
      local_1578.data._M_elems[9] = 0;
      local_1578.data._M_elems[10] = 0;
      local_1578.data._M_elems[0xb] = 0;
      local_1578.data._M_elems[0xc] = 0;
      local_1578.data._M_elems[0xd] = 0;
      local_1578.data._M_elems._56_5_ = 0;
      local_1578.data._M_elems[0xf]._1_3_ = 0;
      local_1578.exp = 0;
      local_1578.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1578,&pnVar6->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_7b0,this);
      bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1528,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1578,&local_7b0);
      if (bVar16) {
        ::soplex::infinity::__tls_init();
        local_18f8.fpclass = cpp_dec_float_finite;
        local_18f8.prec_elem = 0x10;
        local_18f8.data._M_elems[0] = 0;
        local_18f8.data._M_elems[1] = 0;
        local_18f8.data._M_elems[2] = 0;
        local_18f8.data._M_elems[3] = 0;
        local_18f8.data._M_elems[4] = 0;
        local_18f8.data._M_elems[5] = 0;
        local_18f8.data._M_elems[6] = 0;
        local_18f8.data._M_elems[7] = 0;
        local_18f8.data._M_elems[8] = 0;
        local_18f8.data._M_elems[9] = 0;
        local_18f8.data._M_elems[10] = 0;
        local_18f8.data._M_elems[0xb] = 0;
        local_18f8.data._M_elems[0xc] = 0;
        local_18f8.data._M_elems[0xd] = 0;
        local_18f8.data._M_elems._56_5_ = 0;
        local_18f8.data._M_elems[0xf]._1_3_ = 0;
        local_18f8.exp = 0;
        local_18f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_18f8,local_1908);
        if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_18f8.fpclass != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&pnVar1->m_backend,&local_18f8), iVar17 < 0)) {
          VVar21 = ON_UPPER;
          if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
             (VVar21 = ON_UPPER, (this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
            iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&this_00->m_backend,&pnVar1->m_backend);
            VVar21 = (uint)(iVar17 == 0) * 2;
          }
          iVar17 = this->m_j;
          cStatus->data[iVar17] = VVar21;
          pnVar22 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar18 = (long)iVar17 * 0x50;
          uVar28 = (pnVar1->m_backend).data._M_elems[0];
          uVar29 = (this->m_upJ).m_backend.data._M_elems[1];
          uVar30 = (this->m_upJ).m_backend.data._M_elems[2];
          uVar31 = (this->m_upJ).m_backend.data._M_elems[3];
          uVar32 = (this->m_upJ).m_backend.data._M_elems[4];
          uVar33 = (this->m_upJ).m_backend.data._M_elems[5];
          uVar34 = (this->m_upJ).m_backend.data._M_elems[6];
          uVar35 = (this->m_upJ).m_backend.data._M_elems[7];
          uVar36 = (this->m_upJ).m_backend.data._M_elems[8];
          uVar37 = (this->m_upJ).m_backend.data._M_elems[9];
          uVar38 = (this->m_upJ).m_backend.data._M_elems[10];
          uVar39 = (this->m_upJ).m_backend.data._M_elems[0xb];
          uVar40 = (this->m_upJ).m_backend.data._M_elems[0xc];
          uVar41 = (this->m_upJ).m_backend.data._M_elems[0xd];
          uVar42 = (this->m_upJ).m_backend.data._M_elems[0xe];
          uVar43 = (this->m_upJ).m_backend.data._M_elems[0xf];
          goto LAB_00441877;
        }
      }
      iVar17 = this->m_k;
      pnVar22 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_15c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
      local_15c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
      local_15c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_15c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
      local_15c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
      local_15c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
      local_15c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
      local_15c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
      local_15c8.m_backend.exp = pnVar22[iVar17].m_backend.exp;
      local_15c8.m_backend.neg = pnVar22[iVar17].m_backend.neg;
      local_15c8.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
      local_15c8.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&pnVar1->m_backend);
      local_1618.fpclass = cpp_dec_float_finite;
      local_1618.prec_elem = 0x10;
      local_1618.data._M_elems[0] = 0;
      local_1618.data._M_elems[1] = 0;
      local_1618.data._M_elems[2] = 0;
      local_1618.data._M_elems[3] = 0;
      local_1618.data._M_elems[4] = 0;
      local_1618.data._M_elems[5] = 0;
      local_1618.data._M_elems[6] = 0;
      local_1618.data._M_elems[7] = 0;
      local_1618.data._M_elems[8] = 0;
      local_1618.data._M_elems[9] = 0;
      local_1618.data._M_elems[10] = 0;
      local_1618.data._M_elems[0xb] = 0;
      local_1618.data._M_elems[0xc] = 0;
      local_1618.data._M_elems[0xd] = 0;
      local_1618.data._M_elems._56_5_ = 0;
      local_1618.data._M_elems[0xf]._1_3_ = 0;
      local_1618.exp = 0;
      local_1618.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1618,&pnVar6->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_800,this);
      bVar16 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_15c8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1618,&local_800);
      if (bVar16) {
        ::soplex::infinity::__tls_init();
        local_18f8.fpclass = cpp_dec_float_finite;
        local_18f8.prec_elem = 0x10;
        local_18f8.data._M_elems[0] = 0;
        local_18f8.data._M_elems[1] = 0;
        local_18f8.data._M_elems[2] = 0;
        local_18f8.data._M_elems[3] = 0;
        local_18f8.data._M_elems[4] = 0;
        local_18f8.data._M_elems[5] = 0;
        local_18f8.data._M_elems[6] = 0;
        local_18f8.data._M_elems[7] = 0;
        local_18f8.data._M_elems[8] = 0;
        local_18f8.data._M_elems[9] = 0;
        local_18f8.data._M_elems[10] = 0;
        local_18f8.data._M_elems[0xb] = 0;
        local_18f8.data._M_elems[0xc] = 0;
        local_18f8.data._M_elems[0xd] = 0;
        local_18f8.data._M_elems._56_5_ = 0;
        local_18f8.data._M_elems[0xf]._1_3_ = 0;
        local_18f8.exp = 0;
        local_18f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_18f8,
                   (double)CONCAT44(uStack_18a4,local_18a8));
        if ((((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN) ||
            (local_18f8.fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&pnVar6->m_backend,&local_18f8), iVar17 < 1)) goto LAB_0044168d;
        if ((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) {
          fVar4 = (this->m_upK).m_backend.fpclass;
          goto LAB_00441512;
        }
LAB_00441bfd:
        VVar21 = ON_LOWER;
LAB_00441c02:
        iVar17 = this->m_k;
        cStatus->data[iVar17] = VVar21;
        pnVar22 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = *(undefined8 *)(pnVar6->m_backend).data._M_elems;
        uVar8 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
        uVar9 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
        uVar10 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
        uVar11 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
        uVar12 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 10);
        uVar13 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xe);
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar3 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xc);
        *(undefined8 *)(puVar3 + 2) = uVar13;
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar3 = uVar11;
        *(undefined8 *)(puVar3 + 2) = uVar12;
        puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = uVar9;
        *(undefined8 *)(puVar3 + 2) = uVar10;
        *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
        *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
        pnVar22[iVar17].m_backend.exp = (this->m_loK).m_backend.exp;
        pnVar22[iVar17].m_backend.neg = (this->m_loK).m_backend.neg;
        iVar14 = (this->m_loK).m_backend.prec_elem;
        pnVar22[iVar17].m_backend.fpclass = (this->m_loK).m_backend.fpclass;
        pnVar22[iVar17].m_backend.prec_elem = iVar14;
        cStatus->data[this->m_j] = BASIC;
        local_18f8.data._M_elems[0xc] = local_17f8.data._M_elems[0xc];
        local_18f8.data._M_elems[0xd] = local_17f8.data._M_elems[0xd];
        local_18f8.data._M_elems._56_5_ =
             SUB85(CONCAT44(local_17f8.data._M_elems[0xf],local_17f8.data._M_elems[0xe]),0);
        local_18f8.data._M_elems[0xf]._1_3_ = (undefined3)(local_17f8.data._M_elems[0xf] >> 8);
        local_18f8.data._M_elems[8] = local_17f8.data._M_elems[8];
        local_18f8.data._M_elems[9] = local_17f8.data._M_elems[9];
        local_18f8.data._M_elems[10] = local_17f8.data._M_elems[10];
        local_18f8.data._M_elems[0xb] = local_17f8.data._M_elems[0xb];
        local_18f8.data._M_elems[4] = local_17f8.data._M_elems[4];
        local_18f8.data._M_elems[5] = local_17f8.data._M_elems[5];
        local_18f8.data._M_elems[6] = local_17f8.data._M_elems[6];
        local_18f8.data._M_elems[7] = local_17f8.data._M_elems[7];
        local_18f8.data._M_elems[0] = local_17f8.data._M_elems[0];
        local_18f8.data._M_elems[1] = local_17f8.data._M_elems[1];
        local_18f8.data._M_elems[2] = local_17f8.data._M_elems[2];
        local_18f8.data._M_elems[3] = local_17f8.data._M_elems[3];
        local_18f8.exp = local_17f8.exp;
        local_18f8.neg = local_17f8.neg;
        local_18f8.fpclass = local_17f8.fpclass;
        local_18f8.prec_elem = local_17f8.prec_elem;
        pcVar26 = &local_1898;
        goto LAB_00441cdc;
      }
LAB_0044168d:
      iVar17 = this->m_k;
      pnVar22 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_16b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar22[iVar17].m_backend.data;
      local_16b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
      local_16b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_16b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
      local_16b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar3;
      local_16b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar3 + 2);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
      local_16b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar3;
      local_16b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar3 + 2);
      local_16b8.m_backend.exp = pnVar22[iVar17].m_backend.exp;
      local_16b8.m_backend.neg = pnVar22[iVar17].m_backend.neg;
      local_16b8.m_backend.fpclass = pnVar22[iVar17].m_backend.fpclass;
      local_16b8.m_backend.prec_elem = pnVar22[iVar17].m_backend.prec_elem;
      local_1958.fpclass = cpp_dec_float_finite;
      local_1958.prec_elem = 0x10;
      local_1958.data._M_elems[0] = 0;
      local_1958.data._M_elems[1] = 0;
      local_1958.data._M_elems[2] = 0;
      local_1958.data._M_elems[3] = 0;
      local_1958.data._M_elems[4] = 0;
      local_1958.data._M_elems[5] = 0;
      local_1958.data._M_elems[6] = 0;
      local_1958.data._M_elems[7] = 0;
      local_1958.data._M_elems[8] = 0;
      local_1958.data._M_elems[9] = 0;
      local_1958.data._M_elems[10] = 0;
      local_1958.data._M_elems[0xb] = 0;
      local_1958.data._M_elems[0xc] = 0;
      local_1958.data._M_elems[0xd] = 0;
      local_1958.data._M_elems._56_5_ = 0;
      VVar21 = ON_UPPER;
      local_1958.data._M_elems[0xf]._1_3_ = 0;
      local_1958.exp = 0;
      local_1958.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1958,&u_00->m_backend,&pnVar1->m_backend);
      local_1668.fpclass = cpp_dec_float_finite;
      local_1668.prec_elem = 0x10;
      local_1668.data._M_elems[0] = 0;
      local_1668.data._M_elems[1] = 0;
      local_1668.data._M_elems[2] = 0;
      local_1668.data._M_elems[3] = 0;
      local_1668.data._M_elems[4] = 0;
      local_1668.data._M_elems[5] = 0;
      local_1668.data._M_elems[6] = 0;
      local_1668.data._M_elems[7] = 0;
      local_1668.data._M_elems[8] = 0;
      local_1668.data._M_elems[9] = 0;
      local_1668.data._M_elems[10] = 0;
      local_1668.data._M_elems[0xb] = 0;
      local_1668.data._M_elems[0xc] = 0;
      local_1668.data._M_elems[0xd] = 0;
      local_1668.data._M_elems._56_5_ = 0;
      local_1668.data._M_elems[0xf]._1_3_ = 0;
      local_1668.exp = 0;
      local_1668.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1668,&pnVar6->m_backend,&local_1958);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_850,this);
      bVar16 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_16b8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1668,&local_850);
      if (!bVar16) {
        puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_1958.data._M_elems._0_8_ = local_1958.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1958,"XMAISM09 This should never happen.","");
        *puVar20 = &PTR__SPxException_0069d438;
        puVar20[1] = puVar20 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar20 + 1),local_1958.data._M_elems._0_8_,
                   (undefined1 *)(local_1958.data._M_elems._0_8_ + local_1958.data._M_elems._8_8_));
        *puVar20 = &PTR__SPxException_0069d410;
        __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
         ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
        iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&this_00->m_backend,&pnVar1->m_backend);
        VVar21 = (uint)(iVar17 == 0) * 2;
      }
      iVar17 = this->m_j;
      cStatus->data[iVar17] = VVar21;
      pnVar22 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar25 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
      uVar8 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
      uVar9 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
      uVar10 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
      uVar11 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 10);
      uVar13 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xe);
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar3 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar3 + 2) = uVar13;
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar3 = uVar11;
      *(undefined8 *)(puVar3 + 2) = uVar12;
      puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = uVar9;
      *(undefined8 *)(puVar3 + 2) = uVar10;
      *(undefined8 *)&pnVar22[iVar17].m_backend.data = uVar25;
      *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = uVar8;
      pnVar22[iVar17].m_backend.exp = (this->m_upJ).m_backend.exp;
      pnVar22[iVar17].m_backend.neg = (this->m_upJ).m_backend.neg;
      iVar14 = (this->m_upJ).m_backend.prec_elem;
      pnVar22[iVar17].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      pnVar22[iVar17].m_backend.prec_elem = iVar14;
      pcVar26 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    }
    local_1958.fpclass = cpp_dec_float_finite;
    local_1958.prec_elem = 0x10;
    local_1958.data._M_elems[0] = 0;
    local_1958.data._M_elems[1] = 0;
    local_1958.data._M_elems[2] = 0;
    local_1958.data._M_elems[3] = 0;
    local_1958.data._M_elems[4] = 0;
    local_1958.data._M_elems[5] = 0;
    local_1958.data._M_elems[6] = 0;
    local_1958.data._M_elems[7] = 0;
    local_1958.data._M_elems[8] = 0;
    local_1958.data._M_elems[9] = 0;
    local_1958.data._M_elems[10] = 0;
    local_1958.data._M_elems[0xb] = 0;
    local_1958.data._M_elems[0xc] = 0;
    local_1958.data._M_elems[0xd] = 0;
    local_1958.data._M_elems._56_5_ = 0;
    local_1958.data._M_elems[0xf]._1_3_ = 0;
    local_1958.exp = 0;
    local_1958.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_1958,&u_00->m_backend,pcVar26);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_1958);
  }
  pnVar6 = &this->m_scale;
  pcVar27 = &(r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
  local_1898.fpclass = cpp_dec_float_finite;
  local_1898.prec_elem = 0x10;
  local_1898.data._M_elems[0] = 0;
  local_1898.data._M_elems[1] = 0;
  local_1898.data._M_elems[2] = 0;
  local_1898.data._M_elems[3] = 0;
  local_1898.data._M_elems[4] = 0;
  local_1898.data._M_elems[5] = 0;
  local_1898.data._M_elems[6] = 0;
  local_1898.data._M_elems[7] = 0;
  local_1898.data._M_elems[8] = 0;
  local_1898.data._M_elems[9] = 0;
  local_1898.data._M_elems[10] = 0;
  local_1898.data._M_elems[0xb] = 0;
  local_1898.data._M_elems[0xc] = 0;
  local_1898.data._M_elems[0xd] = 0;
  local_1898.data._M_elems._56_5_ = 0;
  local_1898.data._M_elems[0xf]._1_3_ = 0;
  local_1898.exp = 0;
  local_1898.neg = false;
  pcVar26 = &pnVar6->m_backend;
  if ((&local_1898 != pcVar27) && (pcVar26 = pcVar27, &local_1898 != &pnVar6->m_backend)) {
    local_1898.data._M_elems._0_8_ = *(undefined8 *)(pnVar6->m_backend).data._M_elems;
    local_1898.data._M_elems._8_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 2);
    local_1898.data._M_elems._16_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 4);
    local_1898.data._M_elems._24_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 6);
    local_1898.data._M_elems._32_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 8);
    local_1898.data._M_elems._40_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 10);
    local_1898.data._M_elems._48_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 0xc)
    ;
    uVar25 = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 0xe);
    local_1898.data._M_elems._56_5_ = SUB85(uVar25,0);
    local_1898.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar25 >> 0x28);
    local_1898.exp = (this->m_scale).m_backend.exp;
    local_1898.neg = (this->m_scale).m_backend.neg;
    local_1898.fpclass = (this->m_scale).m_backend.fpclass;
    local_1898.prec_elem = (this->m_scale).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_1898,pcVar26);
  iVar17 = this->m_j;
  pnVar22 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar3 = local_1898.data._M_elems._48_8_;
  *(ulong *)(puVar3 + 2) =
       CONCAT35(local_1898.data._M_elems[0xf]._1_3_,local_1898.data._M_elems._56_5_);
  puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar3 = local_1898.data._M_elems._32_8_;
  *(undefined8 *)(puVar3 + 2) = local_1898.data._M_elems._40_8_;
  puVar3 = pnVar22[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = local_1898.data._M_elems._16_8_;
  *(undefined8 *)(puVar3 + 2) = local_1898.data._M_elems._24_8_;
  *(undefined8 *)&pnVar22[iVar17].m_backend.data = local_1898.data._M_elems._0_8_;
  *(undefined8 *)(pnVar22[iVar17].m_backend.data._M_elems + 2) = local_1898.data._M_elems._8_8_;
  pnVar22[iVar17].m_backend.exp = local_1898.exp;
  pnVar22[iVar17].m_backend.neg = local_1898.neg;
  pnVar22[iVar17].m_backend.fpclass = local_1898.fpclass;
  pnVar22[iVar17].m_backend.prec_elem = local_1898.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}